

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int iVar19;
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [12];
  ulong uVar52;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  byte bVar63;
  uint uVar64;
  undefined1 (*pauVar65) [32];
  uint uVar66;
  uint uVar67;
  ulong uVar68;
  bool bVar69;
  int iVar70;
  ulong uVar71;
  bool bVar72;
  undefined4 uVar73;
  undefined8 uVar74;
  vint4 bi_2;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar98 [32];
  undefined1 auVar88 [16];
  undefined1 auVar99 [32];
  undefined1 auVar96 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar97 [32];
  undefined1 auVar102 [64];
  float fVar103;
  float fVar126;
  float fVar127;
  vint4 bi_1;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar170;
  vint4 ai_2;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar171;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  vint4 ai;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [28];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar192;
  float fVar209;
  float fVar210;
  vint4 bi;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar223 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  vint4 ai_1;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  float fVar240;
  float fVar241;
  undefined1 auVar239 [64];
  float fVar242;
  float fVar249;
  float fVar250;
  undefined1 auVar243 [16];
  float fVar251;
  undefined1 auVar245 [32];
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar244 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [64];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b44;
  int local_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [16];
  undefined1 local_a30 [8];
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  RTCFilterFunctionNArguments local_9f0;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined8 local_900;
  undefined4 local_8f8;
  float local_8f4;
  undefined4 local_8f0;
  undefined4 local_8ec;
  uint local_8e8;
  uint local_8e4;
  uint local_8e0;
  ulong local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 auStack_870 [16];
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [16];
  Primitive *local_810;
  ulong local_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined4 local_7a0;
  undefined4 uStack_79c;
  undefined4 uStack_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined4 uStack_788;
  undefined4 uStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  uint uStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar224 [32];
  undefined1 auVar227 [64];
  
  PVar3 = prim[1];
  uVar68 = (ulong)(byte)PVar3;
  fVar103 = *(float *)(prim + uVar68 * 0x19 + 0x12);
  auVar9 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                      *(undefined1 (*) [16])(prim + uVar68 * 0x19 + 6));
  auVar75._0_4_ = fVar103 * auVar9._0_4_;
  auVar75._4_4_ = fVar103 * auVar9._4_4_;
  auVar75._8_4_ = fVar103 * auVar9._8_4_;
  auVar75._12_4_ = fVar103 * auVar9._12_4_;
  auVar193._0_4_ = fVar103 * (ray->dir).field_0.m128[0];
  auVar193._4_4_ = fVar103 * (ray->dir).field_0.m128[1];
  auVar193._8_4_ = fVar103 * (ray->dir).field_0.m128[2];
  auVar193._12_4_ = fVar103 * (ray->dir).field_0.m128[3];
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xb + 6)));
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar68 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  uVar71 = (ulong)(uint)((int)(uVar68 * 9) * 2);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + uVar68 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  uVar71 = (ulong)(uint)((int)(uVar68 * 5) << 2);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + 6)));
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar259._4_4_ = auVar193._0_4_;
  auVar259._0_4_ = auVar193._0_4_;
  auVar259._8_4_ = auVar193._0_4_;
  auVar259._12_4_ = auVar193._0_4_;
  auVar105 = vshufps_avx(auVar193,auVar193,0x55);
  auVar76 = vshufps_avx(auVar193,auVar193,0xaa);
  fVar103 = auVar76._0_4_;
  auVar243._0_4_ = fVar103 * auVar81._0_4_;
  fVar126 = auVar76._4_4_;
  auVar243._4_4_ = fVar126 * auVar81._4_4_;
  fVar127 = auVar76._8_4_;
  auVar243._8_4_ = fVar127 * auVar81._8_4_;
  fVar128 = auVar76._12_4_;
  auVar243._12_4_ = fVar128 * auVar81._12_4_;
  auVar237._0_4_ = auVar7._0_4_ * fVar103;
  auVar237._4_4_ = auVar7._4_4_ * fVar126;
  auVar237._8_4_ = auVar7._8_4_ * fVar127;
  auVar237._12_4_ = auVar7._12_4_ * fVar128;
  auVar228._0_4_ = auVar132._0_4_ * fVar103;
  auVar228._4_4_ = auVar132._4_4_ * fVar126;
  auVar228._8_4_ = auVar132._8_4_ * fVar127;
  auVar228._12_4_ = auVar132._12_4_ * fVar128;
  auVar76 = vfmadd231ps_fma(auVar243,auVar105,auVar85);
  auVar106 = vfmadd231ps_fma(auVar237,auVar105,auVar223);
  auVar105 = vfmadd231ps_fma(auVar228,auVar77,auVar105);
  auVar146 = vfmadd231ps_fma(auVar76,auVar259,auVar9);
  auVar106 = vfmadd231ps_fma(auVar106,auVar259,auVar201);
  auVar176 = vfmadd231ps_fma(auVar105,auVar78,auVar259);
  auVar260._4_4_ = auVar75._0_4_;
  auVar260._0_4_ = auVar75._0_4_;
  auVar260._8_4_ = auVar75._0_4_;
  auVar260._12_4_ = auVar75._0_4_;
  auVar105 = vshufps_avx(auVar75,auVar75,0x55);
  auVar76 = vshufps_avx(auVar75,auVar75,0xaa);
  fVar103 = auVar76._0_4_;
  auVar194._0_4_ = fVar103 * auVar81._0_4_;
  fVar126 = auVar76._4_4_;
  auVar194._4_4_ = fVar126 * auVar81._4_4_;
  fVar127 = auVar76._8_4_;
  auVar194._8_4_ = fVar127 * auVar81._8_4_;
  fVar128 = auVar76._12_4_;
  auVar194._12_4_ = fVar128 * auVar81._12_4_;
  auVar104._0_4_ = auVar7._0_4_ * fVar103;
  auVar104._4_4_ = auVar7._4_4_ * fVar126;
  auVar104._8_4_ = auVar7._8_4_ * fVar127;
  auVar104._12_4_ = auVar7._12_4_ * fVar128;
  auVar76._0_4_ = auVar132._0_4_ * fVar103;
  auVar76._4_4_ = auVar132._4_4_ * fVar126;
  auVar76._8_4_ = auVar132._8_4_ * fVar127;
  auVar76._12_4_ = auVar132._12_4_ * fVar128;
  auVar85 = vfmadd231ps_fma(auVar194,auVar105,auVar85);
  auVar81 = vfmadd231ps_fma(auVar104,auVar105,auVar223);
  auVar223 = vfmadd231ps_fma(auVar76,auVar105,auVar77);
  auVar7 = vfmadd231ps_fma(auVar85,auVar260,auVar9);
  auVar77 = vfmadd231ps_fma(auVar81,auVar260,auVar201);
  auVar132 = vfmadd231ps_fma(auVar223,auVar260,auVar78);
  local_a40._8_4_ = 0x7fffffff;
  local_a40._0_8_ = 0x7fffffff7fffffff;
  local_a40._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx(auVar146,local_a40);
  auVar175._8_4_ = 0x219392ef;
  auVar175._0_8_ = 0x219392ef219392ef;
  auVar175._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar175,1);
  auVar85 = vblendvps_avx(auVar146,auVar175,auVar9);
  auVar9 = vandps_avx(auVar106,local_a40);
  auVar9 = vcmpps_avx(auVar9,auVar175,1);
  auVar81 = vblendvps_avx(auVar106,auVar175,auVar9);
  auVar9 = vandps_avx(auVar176,local_a40);
  auVar9 = vcmpps_avx(auVar9,auVar175,1);
  auVar9 = vblendvps_avx(auVar176,auVar175,auVar9);
  auVar201 = vrcpps_avx(auVar85);
  auVar221._8_4_ = 0x3f800000;
  auVar221._0_8_ = 0x3f8000003f800000;
  auVar221._12_4_ = 0x3f800000;
  auVar85 = vfnmadd213ps_fma(auVar85,auVar201,auVar221);
  auVar201 = vfmadd132ps_fma(auVar85,auVar201,auVar201);
  auVar85 = vrcpps_avx(auVar81);
  auVar81 = vfnmadd213ps_fma(auVar81,auVar85,auVar221);
  auVar223 = vfmadd132ps_fma(auVar81,auVar85,auVar85);
  auVar85 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar85,auVar221);
  auVar78 = vfmadd132ps_fma(auVar9,auVar85,auVar85);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar7);
  auVar176._0_4_ = auVar201._0_4_ * auVar9._0_4_;
  auVar176._4_4_ = auVar201._4_4_ * auVar9._4_4_;
  auVar176._8_4_ = auVar201._8_4_ * auVar9._8_4_;
  auVar176._12_4_ = auVar201._12_4_ * auVar9._12_4_;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar85);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar7);
  auVar195._0_4_ = auVar201._0_4_ * auVar9._0_4_;
  auVar195._4_4_ = auVar201._4_4_ * auVar9._4_4_;
  auVar195._8_4_ = auVar201._8_4_ * auVar9._8_4_;
  auVar195._12_4_ = auVar201._12_4_ * auVar9._12_4_;
  auVar106._1_3_ = 0;
  auVar106[0] = PVar3;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar85 = vpmovsxwd_avx(auVar81);
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar68 * -2 + 6);
  auVar9 = vpmovsxwd_avx(auVar201);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar77);
  auVar229._0_4_ = auVar9._0_4_ * auVar223._0_4_;
  auVar229._4_4_ = auVar9._4_4_ * auVar223._4_4_;
  auVar229._8_4_ = auVar9._8_4_ * auVar223._8_4_;
  auVar229._12_4_ = auVar9._12_4_ * auVar223._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar85);
  auVar9 = vsubps_avx(auVar9,auVar77);
  auVar105._0_4_ = auVar223._0_4_ * auVar9._0_4_;
  auVar105._4_4_ = auVar223._4_4_ * auVar9._4_4_;
  auVar105._8_4_ = auVar223._8_4_ * auVar9._8_4_;
  auVar105._12_4_ = auVar223._12_4_ * auVar9._12_4_;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar71 + uVar68 + 6);
  auVar9 = vpmovsxwd_avx(auVar223);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar132);
  auVar146._0_4_ = auVar78._0_4_ * auVar9._0_4_;
  auVar146._4_4_ = auVar78._4_4_ * auVar9._4_4_;
  auVar146._8_4_ = auVar78._8_4_ * auVar9._8_4_;
  auVar146._12_4_ = auVar78._12_4_ * auVar9._12_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar68 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar7);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar132);
  auVar77._0_4_ = auVar78._0_4_ * auVar9._0_4_;
  auVar77._4_4_ = auVar78._4_4_ * auVar9._4_4_;
  auVar77._8_4_ = auVar78._8_4_ * auVar9._8_4_;
  auVar77._12_4_ = auVar78._12_4_ * auVar9._12_4_;
  auVar9 = vpminsd_avx(auVar176,auVar195);
  auVar85 = vpminsd_avx(auVar229,auVar105);
  auVar9 = vmaxps_avx(auVar9,auVar85);
  auVar85 = vpminsd_avx(auVar146,auVar77);
  uVar73 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar235._4_4_ = uVar73;
  auVar235._0_4_ = uVar73;
  auVar235._8_4_ = uVar73;
  auVar235._12_4_ = uVar73;
  auVar85 = vmaxps_avx(auVar85,auVar235);
  auVar9 = vmaxps_avx(auVar9,auVar85);
  local_4c0._0_4_ = auVar9._0_4_ * 0.99999964;
  local_4c0._4_4_ = auVar9._4_4_ * 0.99999964;
  local_4c0._8_4_ = auVar9._8_4_ * 0.99999964;
  local_4c0._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar176,auVar195);
  auVar85 = vpmaxsd_avx(auVar229,auVar105);
  auVar9 = vminps_avx(auVar9,auVar85);
  auVar85 = vpmaxsd_avx(auVar146,auVar77);
  fVar103 = ray->tfar;
  auVar132._4_4_ = fVar103;
  auVar132._0_4_ = fVar103;
  auVar132._8_4_ = fVar103;
  auVar132._12_4_ = fVar103;
  auVar85 = vminps_avx(auVar85,auVar132);
  auVar9 = vminps_avx(auVar9,auVar85);
  auVar78._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar78._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar78._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar78._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar106[4] = PVar3;
  auVar106._5_3_ = 0;
  auVar106[8] = PVar3;
  auVar106._9_3_ = 0;
  auVar106[0xc] = PVar3;
  auVar106._13_3_ = 0;
  auVar85 = vpcmpgtd_avx(auVar106,_DAT_01f7fcf0);
  auVar9 = vcmpps_avx(local_4c0,auVar78,2);
  auVar9 = vandps_avx(auVar9,auVar85);
  uVar64 = vmovmskps_avx(auVar9);
  if (uVar64 == 0) {
    return false;
  }
  uVar64 = uVar64 & 0xff;
  auVar90._16_16_ = mm_lookupmask_ps._240_16_;
  auVar90._0_16_ = mm_lookupmask_ps._240_16_;
  local_620 = vblendps_avx(auVar90,ZEXT832(0) << 0x20,0x80);
  local_7a0 = 0x7fffffff;
  uStack_79c = 0x7fffffff;
  uStack_798 = 0x7fffffff;
  uStack_794 = 0x7fffffff;
  uStack_790 = 0x7fffffff;
  uStack_78c = 0x7fffffff;
  uStack_788 = 0x7fffffff;
  uStack_784 = 0x7fffffff;
  local_660 = 0x80000000;
  uStack_65c = 0x80000000;
  uStack_658 = 0x80000000;
  uStack_654 = 0x80000000;
  fStack_650 = -0.0;
  fStack_64c = -0.0;
  fStack_648 = -0.0;
  uStack_644 = 0x80000000;
  local_810 = prim;
LAB_0162ffe4:
  lVar20 = 0;
  local_808 = (ulong)uVar64;
  for (uVar71 = local_808; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
    lVar20 = lVar20 + 1;
  }
  uVar64 = *(uint *)(local_810 + 2);
  local_8c8 = (ulong)*(uint *)(local_810 + lVar20 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar64].ptr;
  uVar71 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_8c8);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar20 = *(long *)&pGVar4[1].time_range.upper;
  auVar9 = *(undefined1 (*) [16])(lVar20 + (long)p_Var5 * uVar71);
  auVar85 = *(undefined1 (*) [16])(lVar20 + (uVar71 + 1) * (long)p_Var5);
  auVar81 = *(undefined1 (*) [16])(lVar20 + (uVar71 + 2) * (long)p_Var5);
  local_808 = local_808 - 1 & local_808;
  auVar201 = *(undefined1 (*) [16])(lVar20 + (uVar71 + 3) * (long)p_Var5);
  if (local_808 != 0) {
    uVar68 = local_808 - 1 & local_808;
    for (uVar71 = local_808; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
    }
    if (uVar68 != 0) {
      for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar196._0_4_ = (auVar9._0_4_ + auVar85._0_4_ + auVar81._0_4_ + auVar201._0_4_) * 0.25;
  auVar196._4_4_ = (auVar9._4_4_ + auVar85._4_4_ + auVar81._4_4_ + auVar201._4_4_) * 0.25;
  auVar196._8_4_ = (auVar9._8_4_ + auVar85._8_4_ + auVar81._8_4_ + auVar201._8_4_) * 0.25;
  auVar196._12_4_ = (auVar9._12_4_ + auVar85._12_4_ + auVar81._12_4_ + auVar201._12_4_) * 0.25;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar223 = vsubps_avx(auVar196,(undefined1  [16])aVar1);
  auVar223 = vdpps_avx(auVar223,(undefined1  [16])aVar2,0x7f);
  auVar7 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar78 = vrcpss_avx(auVar7,auVar7);
  auVar7 = vfnmadd213ss_fma(auVar78,auVar7,ZEXT416(0x40000000));
  fVar103 = auVar223._0_4_ * auVar78._0_4_ * auVar7._0_4_;
  local_820 = ZEXT416((uint)fVar103);
  auVar197._4_4_ = fVar103;
  auVar197._0_4_ = fVar103;
  auVar197._8_4_ = fVar103;
  auVar197._12_4_ = fVar103;
  fStack_830 = fVar103;
  _local_840 = auVar197;
  fStack_82c = fVar103;
  fStack_828 = fVar103;
  fStack_824 = fVar103;
  auVar223 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar197);
  auVar223 = vblendps_avx(auVar223,_DAT_01f7aa10,8);
  local_a00 = vsubps_avx(auVar9,auVar223);
  local_a10 = vsubps_avx(auVar81,auVar223);
  local_a20 = vsubps_avx(auVar85,auVar223);
  _local_a30 = vsubps_avx(auVar201,auVar223);
  auVar9 = vmovshdup_avx(local_a00);
  local_1e0 = auVar9._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar9 = vshufps_avx(local_a00,local_a00,0xaa);
  local_200 = auVar9._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar9 = vshufps_avx(local_a00,local_a00,0xff);
  uVar74 = auVar9._0_8_;
  auVar263._8_8_ = uVar74;
  auVar263._0_8_ = uVar74;
  auVar263._16_8_ = uVar74;
  auVar263._24_8_ = uVar74;
  auVar9 = vmovshdup_avx(local_a20);
  local_220 = auVar9._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar9 = vshufps_avx(local_a20,local_a20,0xaa);
  uVar74 = auVar9._0_8_;
  local_a60._8_8_ = uVar74;
  local_a60._0_8_ = uVar74;
  local_a60._16_8_ = uVar74;
  local_a60._24_8_ = uVar74;
  auVar262 = ZEXT3264(local_a60);
  auVar9 = vshufps_avx(local_a20,local_a20,0xff);
  uVar74 = auVar9._0_8_;
  local_920._8_8_ = uVar74;
  local_920._0_8_ = uVar74;
  local_920._16_8_ = uVar74;
  local_920._24_8_ = uVar74;
  auVar255 = ZEXT3264(local_920);
  auVar9 = vmovshdup_avx(local_a10);
  uVar74 = auVar9._0_8_;
  auVar222._8_8_ = uVar74;
  auVar222._0_8_ = uVar74;
  auVar224._16_8_ = uVar74;
  auVar224._0_16_ = auVar222;
  auVar224._24_8_ = uVar74;
  auVar227 = ZEXT3264(auVar224);
  auVar85 = vshufps_avx(local_a10,local_a10,0xaa);
  local_3c0 = auVar85._0_4_;
  fStack_3bc = auVar85._4_4_;
  auVar85 = vshufps_avx(local_a10,local_a10,0xff);
  local_3e0 = auVar85._0_4_;
  fStack_3dc = auVar85._4_4_;
  auVar85 = vmovshdup_avx(_local_a30);
  local_240 = auVar85._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar85 = vshufps_avx(_local_a30,_local_a30,0xaa);
  local_260 = auVar85._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar85 = vshufps_avx(_local_a30,_local_a30,0xff);
  local_280 = auVar85._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar79._0_4_ = aVar2.x * aVar2.x;
  auVar79._4_4_ = aVar2.y * aVar2.y;
  auVar79._8_4_ = aVar2.z * aVar2.z;
  auVar79._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar85 = vshufps_avx(auVar79,auVar79,0xaa);
  uVar73 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_780._4_4_ = uVar73;
  local_780._0_4_ = uVar73;
  fStack_778 = (float)uVar73;
  fStack_774 = (float)uVar73;
  fStack_770 = (float)uVar73;
  fStack_76c = (float)uVar73;
  fStack_768 = (float)uVar73;
  register0x0000149c = uVar73;
  auVar239 = ZEXT3264(_local_780);
  uVar74 = auVar85._0_8_;
  auVar244._8_8_ = uVar74;
  auVar244._0_8_ = uVar74;
  auVar244._16_8_ = uVar74;
  auVar244._24_8_ = uVar74;
  auVar85 = vfmadd231ps_fma(auVar244,_local_780,_local_780);
  uVar73 = *(undefined4 *)&(ray->dir).field_0;
  local_500._4_4_ = uVar73;
  local_500._0_4_ = uVar73;
  fStack_4f8 = (float)uVar73;
  fStack_4f4 = (float)uVar73;
  fStack_4f0 = (float)uVar73;
  fStack_4ec = (float)uVar73;
  fStack_4e8 = (float)uVar73;
  register0x0000121c = uVar73;
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),_local_500,_local_500);
  auVar247 = ZEXT1664(auVar85);
  local_b44 = 1;
  uVar71 = 0;
  bVar69 = false;
  local_520 = (ray->dir).field_0.m128[2];
  uVar73 = local_a00._0_4_;
  local_2e0._4_4_ = uVar73;
  local_2e0._0_4_ = uVar73;
  local_2e0._8_4_ = uVar73;
  local_2e0._12_4_ = uVar73;
  local_2e0._16_4_ = uVar73;
  local_2e0._20_4_ = uVar73;
  local_2e0._24_4_ = uVar73;
  local_2e0._28_4_ = uVar73;
  uVar73 = local_a20._0_4_;
  local_300._4_4_ = uVar73;
  local_300._0_4_ = uVar73;
  local_300._8_4_ = uVar73;
  local_300._12_4_ = uVar73;
  local_300._16_4_ = uVar73;
  local_300._20_4_ = uVar73;
  local_300._24_4_ = uVar73;
  local_300._28_4_ = uVar73;
  uVar73 = local_a10._0_4_;
  local_320._4_4_ = uVar73;
  local_320._0_4_ = uVar73;
  local_320._8_4_ = uVar73;
  local_320._12_4_ = uVar73;
  local_320._16_4_ = uVar73;
  local_320._20_4_ = uVar73;
  local_320._24_4_ = uVar73;
  local_320._28_4_ = uVar73;
  local_340 = local_a30._0_4_;
  auVar138._4_4_ = uStack_79c;
  auVar138._0_4_ = local_7a0;
  auVar138._8_4_ = uStack_798;
  auVar138._12_4_ = uStack_794;
  auVar138._16_4_ = uStack_790;
  auVar138._20_4_ = uStack_78c;
  auVar138._24_4_ = uStack_788;
  auVar138._28_4_ = uStack_784;
  local_420 = vandps_avx(ZEXT1632(auVar85),auVar138);
  local_4b0 = ZEXT816(0x3f80000000000000);
  local_2a0 = ZEXT1632(auVar85);
  local_400 = auVar263;
  fStack_33c = local_340;
  fStack_338 = local_340;
  fStack_334 = local_340;
  fStack_330 = local_340;
  fStack_32c = local_340;
  fStack_328 = local_340;
  fStack_324 = local_340;
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  fStack_3d8 = local_3e0;
  fStack_3d4 = fStack_3dc;
  fStack_3d0 = local_3e0;
  fStack_3cc = fStack_3dc;
  fStack_3c8 = local_3e0;
  fStack_3c4 = fStack_3dc;
  fStack_3b8 = local_3c0;
  fStack_3b4 = fStack_3bc;
  fStack_3b0 = local_3c0;
  fStack_3ac = fStack_3bc;
  fStack_3a8 = local_3c0;
  fStack_3a4 = fStack_3bc;
  do {
    auVar184._8_4_ = 0x3f800000;
    auVar184._0_8_ = 0x3f8000003f800000;
    auVar184._12_4_ = 0x3f800000;
    auVar184._16_4_ = 0x3f800000;
    auVar184._20_4_ = 0x3f800000;
    iVar70 = (int)uVar71;
    auVar184._24_4_ = 0x3f800000;
    auVar184._28_4_ = 0x3f800000;
    auVar85 = vmovshdup_avx(local_4b0);
    auVar85 = vsubps_avx(auVar85,local_4b0);
    fVar129 = auVar85._0_4_;
    fVar131 = fVar129 * 0.04761905;
    local_720._0_4_ = local_4b0._0_4_;
    local_720._4_4_ = local_720._0_4_;
    local_720._8_4_ = local_720._0_4_;
    local_720._12_4_ = local_720._0_4_;
    local_720._16_4_ = local_720._0_4_;
    local_720._20_4_ = local_720._0_4_;
    local_720._24_4_ = local_720._0_4_;
    local_720._28_4_ = local_720._0_4_;
    local_740._4_4_ = fVar129;
    local_740._0_4_ = fVar129;
    local_740._8_4_ = fVar129;
    local_740._12_4_ = fVar129;
    local_740._16_4_ = fVar129;
    local_740._20_4_ = fVar129;
    local_740._24_4_ = fVar129;
    local_740._28_4_ = fVar129;
    auVar85 = vfmadd231ps_fma(local_720,local_740,_DAT_01faff20);
    auVar90 = vsubps_avx(auVar184,ZEXT1632(auVar85));
    fVar103 = auVar85._0_4_;
    auVar248._0_4_ = local_300._0_4_ * fVar103;
    fVar126 = auVar85._4_4_;
    auVar248._4_4_ = local_300._4_4_ * fVar126;
    fVar127 = auVar85._8_4_;
    auVar248._8_4_ = local_300._8_4_ * fVar127;
    fVar128 = auVar85._12_4_;
    auVar248._12_4_ = local_300._12_4_ * fVar128;
    auVar248._16_4_ = local_300._16_4_ * 0.0;
    auVar248._20_4_ = local_300._20_4_ * 0.0;
    auVar248._28_36_ = auVar247._28_36_;
    auVar248._24_4_ = local_300._24_4_ * 0.0;
    auVar59._8_8_ = uStack_218;
    auVar59._0_8_ = local_220;
    auVar59._16_8_ = uStack_210;
    auVar59._24_8_ = uStack_208;
    auVar247._0_4_ = (float)local_220 * fVar103;
    auVar247._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar126;
    auVar247._8_4_ = (float)uStack_218 * fVar127;
    auVar247._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar128;
    auVar247._16_4_ = (float)uStack_210 * 0.0;
    auVar247._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar247._28_36_ = auVar239._28_36_;
    auVar247._24_4_ = (float)uStack_208 * 0.0;
    auVar239._0_4_ = auVar262._0_4_ * fVar103;
    auVar239._4_4_ = auVar262._4_4_ * fVar126;
    auVar239._8_4_ = auVar262._8_4_ * fVar127;
    auVar239._12_4_ = auVar262._12_4_ * fVar128;
    auVar239._16_4_ = auVar262._16_4_ * 0.0;
    auVar239._20_4_ = auVar262._20_4_ * 0.0;
    auVar239._28_36_ = auVar227._28_36_;
    auVar239._24_4_ = auVar262._24_4_ * 0.0;
    auVar10._4_4_ = auVar255._4_4_ * fVar126;
    auVar10._0_4_ = auVar255._0_4_ * fVar103;
    auVar10._8_4_ = auVar255._8_4_ * fVar127;
    auVar10._12_4_ = auVar255._12_4_ * fVar128;
    auVar10._16_4_ = auVar255._16_4_ * 0.0;
    auVar10._20_4_ = auVar255._20_4_ * 0.0;
    auVar10._24_4_ = auVar255._24_4_ * 0.0;
    auVar10._28_4_ = fVar129;
    auVar85 = vfmadd231ps_fma(auVar248._0_32_,auVar90,local_2e0);
    auVar61._8_8_ = uStack_1d8;
    auVar61._0_8_ = local_1e0;
    auVar61._16_8_ = uStack_1d0;
    auVar61._24_8_ = uStack_1c8;
    auVar81 = vfmadd231ps_fma(auVar247._0_32_,auVar90,auVar61);
    auVar60._8_8_ = uStack_1f8;
    auVar60._0_8_ = local_200;
    auVar60._16_8_ = uStack_1f0;
    auVar60._24_8_ = uStack_1e8;
    auVar201 = vfmadd231ps_fma(auVar239._0_32_,auVar90,auVar60);
    auVar223 = vfmadd231ps_fma(auVar10,auVar90,auVar263);
    auVar11._4_4_ = local_320._4_4_ * fVar126;
    auVar11._0_4_ = local_320._0_4_ * fVar103;
    auVar11._8_4_ = local_320._8_4_ * fVar127;
    auVar11._12_4_ = local_320._12_4_ * fVar128;
    auVar11._16_4_ = local_320._16_4_ * 0.0;
    auVar11._20_4_ = local_320._20_4_ * 0.0;
    auVar11._24_4_ = local_320._24_4_ * 0.0;
    auVar11._28_4_ = local_2e0._28_4_;
    fVar129 = auVar9._0_4_;
    fVar130 = auVar9._4_4_;
    auVar139._4_4_ = fVar130 * fVar126;
    auVar139._0_4_ = fVar129 * fVar103;
    auVar139._8_4_ = fVar129 * fVar127;
    auVar139._12_4_ = fVar130 * fVar128;
    auVar139._16_4_ = fVar129 * 0.0;
    auVar139._20_4_ = fVar130 * 0.0;
    auVar139._24_4_ = fVar129 * 0.0;
    auVar139._28_4_ = local_320._28_4_;
    auVar12._4_4_ = fVar126 * fStack_3bc;
    auVar12._0_4_ = fVar103 * local_3c0;
    auVar12._8_4_ = fVar127 * fStack_3b8;
    auVar12._12_4_ = fVar128 * fStack_3b4;
    auVar12._16_4_ = fStack_3b0 * 0.0;
    auVar12._20_4_ = fStack_3ac * 0.0;
    auVar12._24_4_ = fStack_3a8 * 0.0;
    auVar12._28_4_ = 0x3f800000;
    auVar165._4_4_ = fVar126 * fStack_3dc;
    auVar165._0_4_ = fVar103 * local_3e0;
    auVar165._8_4_ = fVar127 * fStack_3d8;
    auVar165._12_4_ = fVar128 * fStack_3d4;
    auVar165._16_4_ = fStack_3d0 * 0.0;
    auVar165._20_4_ = fStack_3cc * 0.0;
    uVar73 = (undefined4)((ulong)uStack_208 >> 0x20);
    auVar165._24_4_ = fStack_3c8 * 0.0;
    auVar165._28_4_ = uVar73;
    auVar7 = vfmadd231ps_fma(auVar11,auVar90,local_300);
    auVar78 = vfmadd231ps_fma(auVar139,auVar90,auVar59);
    auVar77 = vfmadd231ps_fma(auVar12,auVar90,auVar262._0_32_);
    auVar132 = vfmadd231ps_fma(auVar165,auVar90,auVar255._0_32_);
    auVar13._4_4_ = fStack_33c * fVar126;
    auVar13._0_4_ = local_340 * fVar103;
    auVar13._8_4_ = fStack_338 * fVar127;
    auVar13._12_4_ = fStack_334 * fVar128;
    auVar13._16_4_ = fStack_330 * 0.0;
    auVar13._20_4_ = fStack_32c * 0.0;
    auVar13._24_4_ = fStack_328 * 0.0;
    auVar13._28_4_ = fStack_324;
    auVar227._0_4_ = fVar103 * (float)local_240;
    auVar227._4_4_ = fVar126 * local_240._4_4_;
    auVar227._8_4_ = fVar127 * (float)uStack_238;
    auVar227._12_4_ = fVar128 * uStack_238._4_4_;
    auVar227._16_4_ = (float)uStack_230 * 0.0;
    auVar227._20_4_ = uStack_230._4_4_ * 0.0;
    auVar227._28_36_ = auVar255._28_36_;
    auVar227._24_4_ = (float)uStack_228 * 0.0;
    auVar62._28_4_ = fVar130;
    auVar62._0_28_ =
         ZEXT1628(CONCAT412(auVar7._12_4_ * fVar128,
                            CONCAT48(auVar7._8_4_ * fVar127,
                                     CONCAT44(auVar7._4_4_ * fVar126,auVar7._0_4_ * fVar103))));
    auVar85 = vfmadd231ps_fma(auVar62,auVar90,ZEXT1632(auVar85));
    auVar81 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar128 * auVar78._12_4_,
                                                 CONCAT48(fVar127 * auVar78._8_4_,
                                                          CONCAT44(fVar126 * auVar78._4_4_,
                                                                   fVar103 * auVar78._0_4_)))),
                              auVar90,ZEXT1632(auVar81));
    auVar201 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar128 * auVar77._12_4_,
                                                  CONCAT48(fVar127 * auVar77._8_4_,
                                                           CONCAT44(fVar126 * auVar77._4_4_,
                                                                    fVar103 * auVar77._0_4_)))),
                               auVar90,ZEXT1632(auVar201));
    auVar15._28_4_ = local_300._28_4_;
    auVar15._0_28_ =
         ZEXT1628(CONCAT412(fVar128 * auVar132._12_4_,
                            CONCAT48(fVar127 * auVar132._8_4_,
                                     CONCAT44(fVar126 * auVar132._4_4_,fVar103 * auVar132._0_4_))));
    auVar223 = vfmadd231ps_fma(auVar15,auVar90,ZEXT1632(auVar223));
    auVar225._0_4_ = fVar103 * (float)local_260;
    auVar225._4_4_ = fVar126 * local_260._4_4_;
    auVar225._8_4_ = fVar127 * (float)uStack_258;
    auVar225._12_4_ = fVar128 * uStack_258._4_4_;
    auVar225._16_4_ = (float)uStack_250 * 0.0;
    auVar225._20_4_ = uStack_250._4_4_ * 0.0;
    auVar225._24_4_ = (float)uStack_248 * 0.0;
    auVar225._28_4_ = 0;
    auVar105 = vfmadd231ps_fma(auVar13,auVar90,local_320);
    auVar7 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar105._12_4_ * fVar128,
                                                CONCAT48(auVar105._8_4_ * fVar127,
                                                         CONCAT44(auVar105._4_4_ * fVar126,
                                                                  auVar105._0_4_ * fVar103)))),
                             auVar90,ZEXT1632(auVar7));
    auVar230._0_4_ = fVar103 * (float)local_280;
    auVar230._4_4_ = fVar126 * local_280._4_4_;
    auVar230._8_4_ = fVar127 * (float)uStack_278;
    auVar230._12_4_ = fVar128 * uStack_278._4_4_;
    auVar230._16_4_ = (float)uStack_270 * 0.0;
    auVar230._20_4_ = uStack_270._4_4_ * 0.0;
    auVar230._24_4_ = (float)uStack_268 * 0.0;
    auVar230._28_4_ = 0;
    auVar105 = vfmadd231ps_fma(auVar227._0_32_,auVar90,auVar224);
    auVar57._4_4_ = fStack_3bc;
    auVar57._0_4_ = local_3c0;
    auVar57._8_4_ = fStack_3b8;
    auVar57._12_4_ = fStack_3b4;
    auVar57._16_4_ = fStack_3b0;
    auVar57._20_4_ = fStack_3ac;
    auVar57._24_4_ = fStack_3a8;
    auVar57._28_4_ = fStack_3a4;
    auVar76 = vfmadd231ps_fma(auVar225,auVar90,auVar57);
    auVar91._4_4_ = fStack_3dc;
    auVar91._0_4_ = local_3e0;
    auVar91._8_4_ = fStack_3d8;
    auVar91._12_4_ = fStack_3d4;
    auVar91._16_4_ = fStack_3d0;
    auVar91._20_4_ = fStack_3cc;
    auVar91._24_4_ = fStack_3c8;
    auVar91._28_4_ = fStack_3c4;
    auVar106 = vfmadd231ps_fma(auVar230,auVar90,auVar91);
    auVar255._28_36_ = auVar262._28_36_;
    auVar255._0_28_ =
         ZEXT1628(CONCAT412(auVar106._12_4_ * fVar128,
                            CONCAT48(auVar106._8_4_ * fVar127,
                                     CONCAT44(auVar106._4_4_ * fVar126,auVar106._0_4_ * fVar103))));
    auVar78 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar105._12_4_ * fVar128,
                                                 CONCAT48(auVar105._8_4_ * fVar127,
                                                          CONCAT44(auVar105._4_4_ * fVar126,
                                                                   auVar105._0_4_ * fVar103)))),
                              auVar90,ZEXT1632(auVar78));
    auVar77 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar128 * auVar76._12_4_,
                                                 CONCAT48(fVar127 * auVar76._8_4_,
                                                          CONCAT44(fVar126 * auVar76._4_4_,
                                                                   fVar103 * auVar76._0_4_)))),
                              auVar90,ZEXT1632(auVar77));
    auVar132 = vfmadd231ps_fma(auVar255._0_32_,auVar90,ZEXT1632(auVar132));
    auVar16._28_4_ = local_320._28_4_;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(auVar78._12_4_ * fVar128,
                            CONCAT48(auVar78._8_4_ * fVar127,
                                     CONCAT44(auVar78._4_4_ * fVar126,auVar78._0_4_ * fVar103))));
    auVar17._28_4_ = uVar73;
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(fVar128 * auVar77._12_4_,
                            CONCAT48(fVar127 * auVar77._8_4_,
                                     CONCAT44(fVar126 * auVar77._4_4_,fVar103 * auVar77._0_4_))));
    auVar105 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar7._12_4_ * fVar128,
                                                  CONCAT48(auVar7._8_4_ * fVar127,
                                                           CONCAT44(auVar7._4_4_ * fVar126,
                                                                    auVar7._0_4_ * fVar103)))),
                               auVar90,ZEXT1632(auVar85));
    auVar76 = vfmadd231ps_fma(auVar16,auVar90,ZEXT1632(auVar81));
    auVar91 = ZEXT1632(auVar76);
    auVar76 = vfmadd231ps_fma(auVar17,auVar90,ZEXT1632(auVar201));
    auVar106 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar132._12_4_ * fVar128,
                                                  CONCAT48(auVar132._8_4_ * fVar127,
                                                           CONCAT44(auVar132._4_4_ * fVar126,
                                                                    auVar132._0_4_ * fVar103)))),
                               ZEXT1632(auVar223),auVar90);
    auVar263 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar85));
    auVar90 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar81));
    auVar138 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar201));
    auVar244 = vsubps_avx(ZEXT1632(auVar132),ZEXT1632(auVar223));
    fVar192 = fVar131 * auVar263._0_4_ * 3.0;
    fVar209 = fVar131 * auVar263._4_4_ * 3.0;
    local_6e0._4_4_ = fVar209;
    local_6e0._0_4_ = fVar192;
    fVar210 = fVar131 * auVar263._8_4_ * 3.0;
    local_6e0._8_4_ = fVar210;
    fVar211 = fVar131 * auVar263._12_4_ * 3.0;
    local_6e0._12_4_ = fVar211;
    fVar212 = fVar131 * auVar263._16_4_ * 3.0;
    local_6e0._16_4_ = fVar212;
    fVar213 = fVar131 * auVar263._20_4_ * 3.0;
    local_6e0._20_4_ = fVar213;
    fVar214 = fVar131 * auVar263._24_4_ * 3.0;
    local_6e0._24_4_ = fVar214;
    local_6e0._28_4_ = 0x40400000;
    local_980._0_4_ = fVar131 * auVar90._0_4_ * 3.0;
    local_980._4_4_ = fVar131 * auVar90._4_4_ * 3.0;
    local_980._8_4_ = fVar131 * auVar90._8_4_ * 3.0;
    local_980._12_4_ = fVar131 * auVar90._12_4_ * 3.0;
    local_980._16_4_ = fVar131 * auVar90._16_4_ * 3.0;
    local_980._20_4_ = fVar131 * auVar90._20_4_ * 3.0;
    local_980._24_4_ = fVar131 * auVar90._24_4_ * 3.0;
    local_980._28_4_ = 0;
    local_a80._0_4_ = fVar131 * auVar138._0_4_ * 3.0;
    local_a80._4_4_ = fVar131 * auVar138._4_4_ * 3.0;
    local_a80._8_4_ = fVar131 * auVar138._8_4_ * 3.0;
    local_a80._12_4_ = fVar131 * auVar138._12_4_ * 3.0;
    local_a80._16_4_ = fVar131 * auVar138._16_4_ * 3.0;
    local_a80._20_4_ = fVar131 * auVar138._20_4_ * 3.0;
    local_a80._24_4_ = fVar131 * auVar138._24_4_ * 3.0;
    local_a80._28_4_ = 0;
    fVar103 = fVar131 * auVar244._0_4_ * 3.0;
    fVar126 = fVar131 * auVar244._4_4_ * 3.0;
    auVar18._4_4_ = fVar126;
    auVar18._0_4_ = fVar103;
    fVar127 = fVar131 * auVar244._8_4_ * 3.0;
    auVar18._8_4_ = fVar127;
    fVar128 = fVar131 * auVar244._12_4_ * 3.0;
    auVar18._12_4_ = fVar128;
    fVar129 = fVar131 * auVar244._16_4_ * 3.0;
    auVar18._16_4_ = fVar129;
    fVar130 = fVar131 * auVar244._20_4_ * 3.0;
    auVar18._20_4_ = fVar130;
    fVar131 = fVar131 * auVar244._24_4_ * 3.0;
    auVar18._24_4_ = fVar131;
    auVar18._28_4_ = auVar263._28_4_;
    local_ac0 = ZEXT1632(auVar105);
    auVar15 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar105));
    auVar16 = vpermps_avx2(_DAT_01fec480,auVar91);
    local_960 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar76));
    auVar10 = vsubps_avx(auVar15,local_ac0);
    auVar11 = vsubps_avx(local_960,ZEXT1632(auVar76));
    fVar170 = auVar11._0_4_;
    fVar171 = auVar11._4_4_;
    auVar231._4_4_ = fVar171 * fVar209;
    auVar231._0_4_ = fVar170 * fVar192;
    fVar192 = auVar11._8_4_;
    auVar231._8_4_ = fVar192 * fVar210;
    fVar209 = auVar11._12_4_;
    auVar231._12_4_ = fVar209 * fVar211;
    fVar210 = auVar11._16_4_;
    auVar231._16_4_ = fVar210 * fVar212;
    fVar211 = auVar11._20_4_;
    auVar231._20_4_ = fVar211 * fVar213;
    fVar212 = auVar11._24_4_;
    auVar231._24_4_ = fVar212 * fVar214;
    auVar231._28_4_ = auVar15._28_4_;
    auVar85 = vfmsub231ps_fma(auVar231,local_a80,auVar10);
    _local_5e0 = vsubps_avx(auVar16,auVar91);
    fVar213 = auVar10._0_4_;
    fVar214 = auVar10._4_4_;
    auVar264._4_4_ = fVar214 * local_980._4_4_;
    auVar264._0_4_ = fVar213 * (float)local_980._0_4_;
    fVar172 = auVar10._8_4_;
    auVar264._8_4_ = fVar172 * local_980._8_4_;
    fVar173 = auVar10._12_4_;
    auVar264._12_4_ = fVar173 * local_980._12_4_;
    fVar174 = auVar10._16_4_;
    auVar264._16_4_ = fVar174 * local_980._16_4_;
    fVar240 = auVar10._20_4_;
    auVar264._20_4_ = fVar240 * local_980._20_4_;
    fVar241 = auVar10._24_4_;
    auVar264._24_4_ = fVar241 * local_980._24_4_;
    auVar264._28_4_ = auVar16._28_4_;
    auVar81 = vfmsub231ps_fma(auVar264,local_6e0,_local_5e0);
    auVar164._28_4_ = local_960._28_4_;
    auVar164._0_28_ =
         ZEXT1628(CONCAT412(auVar81._12_4_ * auVar81._12_4_,
                            CONCAT48(auVar81._8_4_ * auVar81._8_4_,
                                     CONCAT44(auVar81._4_4_ * auVar81._4_4_,
                                              auVar81._0_4_ * auVar81._0_4_))));
    auVar85 = vfmadd231ps_fma(auVar164,ZEXT1632(auVar85),ZEXT1632(auVar85));
    fVar242 = local_5e0._0_4_;
    auVar92._0_4_ = fVar242 * (float)local_a80._0_4_;
    fVar249 = local_5e0._4_4_;
    auVar92._4_4_ = fVar249 * local_a80._4_4_;
    fVar250 = local_5e0._8_4_;
    auVar92._8_4_ = fVar250 * local_a80._8_4_;
    fVar251 = local_5e0._12_4_;
    auVar92._12_4_ = fVar251 * local_a80._12_4_;
    fVar252 = local_5e0._16_4_;
    auVar92._16_4_ = fVar252 * local_a80._16_4_;
    fVar253 = local_5e0._20_4_;
    auVar92._20_4_ = fVar253 * local_a80._20_4_;
    fVar254 = local_5e0._24_4_;
    auVar92._24_4_ = fVar254 * local_a80._24_4_;
    auVar92._28_4_ = 0;
    auVar201 = vfmsub231ps_fma(auVar92,local_980,auVar11);
    auVar137._0_4_ = fVar170 * fVar170;
    auVar137._4_4_ = fVar171 * fVar171;
    auVar137._8_4_ = fVar192 * fVar192;
    auVar137._12_4_ = fVar209 * fVar209;
    auVar137._16_4_ = fVar210 * fVar210;
    auVar137._20_4_ = fVar211 * fVar211;
    auVar137._24_4_ = fVar212 * fVar212;
    auVar137._28_4_ = 0;
    auVar81 = vfmadd231ps_fma(auVar137,_local_5e0,_local_5e0);
    auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar10,auVar10);
    auVar90 = vrcpps_avx(ZEXT1632(auVar81));
    auVar201 = vfmadd231ps_fma(ZEXT1632(auVar85),ZEXT1632(auVar201),ZEXT1632(auVar201));
    auVar256._8_4_ = 0x3f800000;
    auVar256._0_8_ = 0x3f8000003f800000;
    auVar256._12_4_ = 0x3f800000;
    auVar256._16_4_ = 0x3f800000;
    auVar256._20_4_ = 0x3f800000;
    auVar256._24_4_ = 0x3f800000;
    auVar256._28_4_ = 0x3f800000;
    auVar85 = vfnmadd213ps_fma(auVar90,ZEXT1632(auVar81),auVar256);
    auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar90,auVar90);
    local_aa0 = vpermps_avx2(_DAT_01fec480,local_6e0);
    local_8a0 = vpermps_avx2(_DAT_01fec480,local_a80);
    auVar163._4_4_ = local_aa0._4_4_ * fVar171;
    auVar163._0_4_ = local_aa0._0_4_ * fVar170;
    auVar163._8_4_ = local_aa0._8_4_ * fVar192;
    auVar163._12_4_ = local_aa0._12_4_ * fVar209;
    auVar163._16_4_ = local_aa0._16_4_ * fVar210;
    auVar163._20_4_ = local_aa0._20_4_ * fVar211;
    auVar163._24_4_ = local_aa0._24_4_ * fVar212;
    auVar163._28_4_ = auVar90._28_4_;
    auVar223 = vfmsub231ps_fma(auVar163,local_8a0,auVar10);
    local_700 = vpermps_avx2(_DAT_01fec480,local_980);
    auVar8._4_4_ = fVar214 * local_700._4_4_;
    auVar8._0_4_ = fVar213 * local_700._0_4_;
    auVar8._8_4_ = fVar172 * local_700._8_4_;
    auVar8._12_4_ = fVar173 * local_700._12_4_;
    auVar8._16_4_ = fVar174 * local_700._16_4_;
    auVar8._20_4_ = fVar240 * local_700._20_4_;
    auVar8._24_4_ = fVar241 * local_700._24_4_;
    auVar8._28_4_ = 0x40400000;
    auVar7 = vfmsub231ps_fma(auVar8,local_aa0,_local_5e0);
    auVar223 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar7._12_4_ * auVar7._12_4_,
                                                  CONCAT48(auVar7._8_4_ * auVar7._8_4_,
                                                           CONCAT44(auVar7._4_4_ * auVar7._4_4_,
                                                                    auVar7._0_4_ * auVar7._0_4_)))),
                               ZEXT1632(auVar223),ZEXT1632(auVar223));
    auVar185._0_4_ = fVar242 * local_8a0._0_4_;
    auVar185._4_4_ = fVar249 * local_8a0._4_4_;
    auVar185._8_4_ = fVar250 * local_8a0._8_4_;
    auVar185._12_4_ = fVar251 * local_8a0._12_4_;
    auVar185._16_4_ = fVar252 * local_8a0._16_4_;
    auVar185._20_4_ = fVar253 * local_8a0._20_4_;
    auVar185._24_4_ = fVar254 * local_8a0._24_4_;
    auVar185._28_4_ = 0;
    auVar7 = vfmsub231ps_fma(auVar185,local_700,auVar11);
    auVar223 = vfmadd231ps_fma(ZEXT1632(auVar223),ZEXT1632(auVar7),ZEXT1632(auVar7));
    auVar90 = vmaxps_avx(ZEXT1632(CONCAT412(auVar201._12_4_ * auVar85._12_4_,
                                            CONCAT48(auVar201._8_4_ * auVar85._8_4_,
                                                     CONCAT44(auVar201._4_4_ * auVar85._4_4_,
                                                              auVar201._0_4_ * auVar85._0_4_)))),
                         ZEXT1632(CONCAT412(auVar223._12_4_ * auVar85._12_4_,
                                            CONCAT48(auVar223._8_4_ * auVar85._8_4_,
                                                     CONCAT44(auVar223._4_4_ * auVar85._4_4_,
                                                              auVar223._0_4_ * auVar85._0_4_)))));
    auVar161._0_4_ = auVar106._0_4_ + fVar103;
    auVar161._4_4_ = auVar106._4_4_ + fVar126;
    auVar161._8_4_ = auVar106._8_4_ + fVar127;
    auVar161._12_4_ = auVar106._12_4_ + fVar128;
    auVar161._16_4_ = fVar129 + 0.0;
    auVar161._20_4_ = fVar130 + 0.0;
    auVar161._24_4_ = fVar131 + 0.0;
    auVar161._28_4_ = auVar263._28_4_ + 0.0;
    auVar231 = ZEXT1632(auVar106);
    local_760._16_16_ = (undefined1  [16])0x0;
    auVar263 = vsubps_avx(auVar231,auVar18);
    auVar17 = vpermps_avx2(_DAT_01fec480,auVar263);
    auVar18 = vpermps_avx2(_DAT_01fec480,auVar231);
    auVar263 = vmaxps_avx(auVar231,auVar161);
    auVar138 = vmaxps_avx(auVar17,auVar18);
    auVar244 = vrsqrtps_avx(ZEXT1632(auVar81));
    auVar263 = vmaxps_avx(auVar263,auVar138);
    fVar103 = auVar244._0_4_;
    fVar126 = auVar244._4_4_;
    fVar127 = auVar244._8_4_;
    fVar128 = auVar244._12_4_;
    fVar131 = auVar244._16_4_;
    fVar129 = auVar244._20_4_;
    fVar130 = auVar244._24_4_;
    auVar14._4_4_ = fVar126 * fVar126 * fVar126 * auVar81._4_4_ * -0.5;
    auVar14._0_4_ = fVar103 * fVar103 * fVar103 * auVar81._0_4_ * -0.5;
    auVar14._8_4_ = fVar127 * fVar127 * fVar127 * auVar81._8_4_ * -0.5;
    auVar14._12_4_ = fVar128 * fVar128 * fVar128 * auVar81._12_4_ * -0.5;
    auVar14._16_4_ = fVar131 * fVar131 * fVar131 * -0.0;
    auVar14._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
    auVar14._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
    auVar14._28_4_ = 0;
    auVar93._8_4_ = 0x3fc00000;
    auVar93._0_8_ = 0x3fc000003fc00000;
    auVar93._12_4_ = 0x3fc00000;
    auVar93._16_4_ = 0x3fc00000;
    auVar93._20_4_ = 0x3fc00000;
    auVar93._24_4_ = 0x3fc00000;
    auVar93._28_4_ = 0x3fc00000;
    auVar85 = vfmadd231ps_fma(auVar14,auVar93,auVar244);
    fVar126 = auVar85._0_4_;
    fVar127 = auVar85._4_4_;
    auVar21._4_4_ = fVar249 * fVar127;
    auVar21._0_4_ = fVar242 * fVar126;
    fVar131 = auVar85._8_4_;
    auVar21._8_4_ = fVar250 * fVar131;
    fVar130 = auVar85._12_4_;
    auVar21._12_4_ = fVar251 * fVar130;
    auVar21._16_4_ = fVar252 * 0.0;
    auVar21._20_4_ = fVar253 * 0.0;
    auVar21._24_4_ = fVar254 * 0.0;
    auVar21._28_4_ = 0x3fc00000;
    auVar261._0_4_ = local_520 * fVar170 * fVar126;
    auVar261._4_4_ = fStack_51c * fVar171 * fVar127;
    auVar261._8_4_ = fStack_518 * fVar192 * fVar131;
    auVar261._12_4_ = fStack_514 * fVar209 * fVar130;
    auVar261._16_4_ = fStack_510 * fVar210 * 0.0;
    auVar261._20_4_ = fStack_50c * fVar211 * 0.0;
    auVar261._24_4_ = fStack_508 * fVar212 * 0.0;
    auVar261._28_4_ = 0;
    auVar81 = vfmadd231ps_fma(auVar261,auVar21,_local_780);
    auVar264 = ZEXT1632(auVar76);
    local_8c0 = vsubps_avx(ZEXT832(0) << 0x20,auVar264);
    fVar242 = local_8c0._0_4_;
    fVar249 = local_8c0._4_4_;
    auVar22._4_4_ = fVar249 * fVar171 * fVar127;
    auVar22._0_4_ = fVar242 * fVar170 * fVar126;
    fVar170 = local_8c0._8_4_;
    auVar22._8_4_ = fVar170 * fVar192 * fVar131;
    fVar171 = local_8c0._12_4_;
    auVar22._12_4_ = fVar171 * fVar209 * fVar130;
    fVar250 = local_8c0._16_4_;
    auVar22._16_4_ = fVar250 * fVar210 * 0.0;
    fVar251 = local_8c0._20_4_;
    auVar22._20_4_ = fVar251 * fVar211 * 0.0;
    fVar252 = local_8c0._24_4_;
    auVar22._24_4_ = fVar252 * fVar212 * 0.0;
    auVar22._28_4_ = auVar11._28_4_;
    auVar244 = vsubps_avx(ZEXT832(0) << 0x20,auVar91);
    auVar201 = vfmadd231ps_fma(auVar22,auVar244,auVar21);
    auVar23._4_4_ = fVar214 * fVar127;
    auVar23._0_4_ = fVar213 * fVar126;
    auVar23._8_4_ = fVar172 * fVar131;
    auVar23._12_4_ = fVar173 * fVar130;
    auVar23._16_4_ = fVar174 * 0.0;
    auVar23._20_4_ = fVar240 * 0.0;
    auVar23._24_4_ = fVar241 * 0.0;
    auVar23._28_4_ = 0x3fc00000;
    auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar23,_local_500);
    auVar139 = vsubps_avx(ZEXT832(0) << 0x20,local_ac0);
    auVar247 = ZEXT3264(auVar139);
    auVar201 = vfmadd231ps_fma(ZEXT1632(auVar201),auVar139,auVar23);
    auVar227 = ZEXT1664(auVar201);
    auVar24._4_4_ = fStack_51c * fVar249;
    auVar24._0_4_ = local_520 * fVar242;
    auVar24._8_4_ = fStack_518 * fVar170;
    auVar24._12_4_ = fStack_514 * fVar171;
    auVar24._16_4_ = fStack_510 * fVar250;
    auVar24._20_4_ = fStack_50c * fVar251;
    auVar24._24_4_ = fStack_508 * fVar252;
    auVar24._28_4_ = 0x3fc00000;
    auVar223 = vfmadd231ps_fma(auVar24,_local_780,auVar244);
    auVar223 = vfmadd231ps_fma(ZEXT1632(auVar223),_local_500,auVar139);
    fVar103 = auVar201._0_4_;
    fVar212 = auVar81._0_4_;
    fVar128 = auVar201._4_4_;
    fVar213 = auVar81._4_4_;
    fVar129 = auVar201._8_4_;
    fVar214 = auVar81._8_4_;
    fVar192 = auVar201._12_4_;
    fVar172 = auVar81._12_4_;
    auVar12 = vsubps_avx(ZEXT1632(auVar223),
                         ZEXT1632(CONCAT412(fVar172 * fVar192,
                                            CONCAT48(fVar214 * fVar129,
                                                     CONCAT44(fVar213 * fVar128,fVar212 * fVar103)))
                                 ));
    auVar25._4_4_ = fVar249 * fVar249;
    auVar25._0_4_ = fVar242 * fVar242;
    auVar25._8_4_ = fVar170 * fVar170;
    auVar25._12_4_ = fVar171 * fVar171;
    auVar25._16_4_ = fVar250 * fVar250;
    auVar25._20_4_ = fVar251 * fVar251;
    auVar25._24_4_ = fVar252 * fVar252;
    auVar25._28_4_ = 0;
    auVar223 = vfmadd231ps_fma(auVar25,auVar244,auVar244);
    auVar223 = vfmadd231ps_fma(ZEXT1632(auVar223),auVar139,auVar139);
    auVar26._28_4_ = local_500._28_4_;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(fVar192 * fVar192,
                            CONCAT48(fVar129 * fVar129,CONCAT44(fVar128 * fVar128,fVar103 * fVar103)
                                    )));
    auVar165 = vsubps_avx(ZEXT1632(auVar223),auVar26);
    auVar138 = vsqrtps_avx(auVar90);
    fVar103 = (auVar138._0_4_ + auVar263._0_4_) * 1.0000002;
    fVar128 = (auVar138._4_4_ + auVar263._4_4_) * 1.0000002;
    fVar129 = (auVar138._8_4_ + auVar263._8_4_) * 1.0000002;
    fVar192 = (auVar138._12_4_ + auVar263._12_4_) * 1.0000002;
    fVar209 = (auVar138._16_4_ + auVar263._16_4_) * 1.0000002;
    fVar210 = (auVar138._20_4_ + auVar263._20_4_) * 1.0000002;
    fVar211 = (auVar138._24_4_ + auVar263._24_4_) * 1.0000002;
    auVar27._4_4_ = fVar128 * fVar128;
    auVar27._0_4_ = fVar103 * fVar103;
    auVar27._8_4_ = fVar129 * fVar129;
    auVar27._12_4_ = fVar192 * fVar192;
    auVar27._16_4_ = fVar209 * fVar209;
    auVar27._20_4_ = fVar210 * fVar210;
    auVar27._24_4_ = fVar211 * fVar211;
    auVar27._28_4_ = auVar138._28_4_ + auVar263._28_4_;
    auVar236._0_4_ = auVar12._0_4_ + auVar12._0_4_;
    auVar236._4_4_ = auVar12._4_4_ + auVar12._4_4_;
    auVar236._8_4_ = auVar12._8_4_ + auVar12._8_4_;
    auVar236._12_4_ = auVar12._12_4_ + auVar12._12_4_;
    auVar236._16_4_ = auVar12._16_4_ + auVar12._16_4_;
    auVar236._20_4_ = auVar12._20_4_ + auVar12._20_4_;
    auVar236._24_4_ = auVar12._24_4_ + auVar12._24_4_;
    auVar236._28_4_ = auVar12._28_4_ + auVar12._28_4_;
    auVar263 = vsubps_avx(auVar165,auVar27);
    local_860._28_4_ = fStack_504;
    local_860._0_28_ =
         ZEXT1628(CONCAT412(fVar172 * fVar172,
                            CONCAT48(fVar214 * fVar214,CONCAT44(fVar213 * fVar213,fVar212 * fVar212)
                                    )));
    auVar12 = vsubps_avx(local_2a0,local_860);
    auVar28._4_4_ = auVar236._4_4_ * auVar236._4_4_;
    auVar28._0_4_ = auVar236._0_4_ * auVar236._0_4_;
    auVar28._8_4_ = auVar236._8_4_ * auVar236._8_4_;
    auVar28._12_4_ = auVar236._12_4_ * auVar236._12_4_;
    auVar28._16_4_ = auVar236._16_4_ * auVar236._16_4_;
    auVar28._20_4_ = auVar236._20_4_ * auVar236._20_4_;
    auVar28._24_4_ = auVar236._24_4_ * auVar236._24_4_;
    auVar28._28_4_ = 0x3f800002;
    fVar128 = auVar12._0_4_;
    fVar129 = auVar12._4_4_;
    fVar192 = auVar12._8_4_;
    fVar209 = auVar12._12_4_;
    fVar210 = auVar12._16_4_;
    fVar211 = auVar12._20_4_;
    fVar212 = auVar12._24_4_;
    auVar29._4_4_ = fVar129 * 4.0 * auVar263._4_4_;
    auVar29._0_4_ = fVar128 * 4.0 * auVar263._0_4_;
    auVar29._8_4_ = fVar192 * 4.0 * auVar263._8_4_;
    auVar29._12_4_ = fVar209 * 4.0 * auVar263._12_4_;
    auVar29._16_4_ = fVar210 * 4.0 * auVar263._16_4_;
    auVar29._20_4_ = fVar211 * 4.0 * auVar263._20_4_;
    auVar29._24_4_ = fVar212 * 4.0 * auVar263._24_4_;
    auVar29._28_4_ = 0x40800000;
    auVar13 = vsubps_avx(auVar28,auVar29);
    auVar90 = vcmpps_avx(auVar13,ZEXT432(0) << 0x20,5);
    local_2c0 = ZEXT1632(auVar85);
    local_9a0 = ZEXT1632(auVar201);
    fVar103 = auVar12._28_4_;
    if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar90 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar90 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar90 >> 0x7f,0) == '\0') &&
          (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar90 >> 0xbf,0) == '\0') &&
        (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar90[0x1f]) {
      auVar265._8_4_ = 0x7f800000;
      auVar265._0_8_ = 0x7f8000007f800000;
      auVar265._12_4_ = 0x7f800000;
      auVar265._16_4_ = 0x7f800000;
      auVar265._20_4_ = 0x7f800000;
      auVar265._24_4_ = 0x7f800000;
      auVar265._28_4_ = 0x7f800000;
      auVar186._8_4_ = 0xff800000;
      auVar186._0_8_ = 0xff800000ff800000;
      auVar186._12_4_ = 0xff800000;
      auVar186._16_4_ = 0xff800000;
      auVar186._20_4_ = 0xff800000;
      auVar186._24_4_ = 0xff800000;
      auVar186._28_4_ = 0xff800000;
      auVar6 = local_2a0;
    }
    else {
      auVar8 = vsqrtps_avx(auVar13);
      auVar266._0_4_ = fVar128 + fVar128;
      auVar266._4_4_ = fVar129 + fVar129;
      auVar266._8_4_ = fVar192 + fVar192;
      auVar266._12_4_ = fVar209 + fVar209;
      auVar266._16_4_ = fVar210 + fVar210;
      auVar266._20_4_ = fVar211 + fVar211;
      auVar266._24_4_ = fVar212 + fVar212;
      auVar266._28_4_ = fVar103 + fVar103;
      auVar163 = vrcpps_avx(auVar266);
      auVar164 = vcmpps_avx(auVar13,ZEXT432(0) << 0x20,5);
      auVar187._8_4_ = 0x3f800000;
      auVar187._0_8_ = 0x3f8000003f800000;
      auVar187._12_4_ = 0x3f800000;
      auVar187._16_4_ = 0x3f800000;
      auVar187._20_4_ = 0x3f800000;
      auVar187._24_4_ = 0x3f800000;
      auVar187._28_4_ = 0x3f800000;
      auVar85 = vfnmadd213ps_fma(auVar266,auVar163,auVar187);
      auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar163,auVar163);
      auVar188._0_4_ = (uint)auVar236._0_4_ ^ local_660;
      auVar188._4_4_ = (uint)auVar236._4_4_ ^ uStack_65c;
      auVar188._8_4_ = (uint)auVar236._8_4_ ^ uStack_658;
      auVar188._12_4_ = (uint)auVar236._12_4_ ^ uStack_654;
      auVar188._16_4_ = (uint)auVar236._16_4_ ^ (uint)fStack_650;
      auVar188._20_4_ = (uint)auVar236._20_4_ ^ (uint)fStack_64c;
      auVar188._24_4_ = (uint)auVar236._24_4_ ^ (uint)fStack_648;
      auVar188._28_4_ = (uint)auVar236._28_4_ ^ uStack_644;
      auVar14 = vsubps_avx(auVar188,auVar8);
      auVar30._4_4_ = auVar85._4_4_ * auVar14._4_4_;
      auVar30._0_4_ = auVar85._0_4_ * auVar14._0_4_;
      auVar30._8_4_ = auVar85._8_4_ * auVar14._8_4_;
      auVar30._12_4_ = auVar85._12_4_ * auVar14._12_4_;
      auVar30._16_4_ = auVar14._16_4_ * 0.0;
      auVar30._20_4_ = auVar14._20_4_ * 0.0;
      auVar30._24_4_ = auVar14._24_4_ * 0.0;
      auVar30._28_4_ = auVar14._28_4_;
      auVar13 = vsubps_avx(auVar8,auVar236);
      auVar31._4_4_ = auVar85._4_4_ * auVar13._4_4_;
      auVar31._0_4_ = auVar85._0_4_ * auVar13._0_4_;
      auVar31._8_4_ = auVar85._8_4_ * auVar13._8_4_;
      auVar31._12_4_ = auVar85._12_4_ * auVar13._12_4_;
      auVar31._16_4_ = auVar13._16_4_ * 0.0;
      auVar31._20_4_ = auVar13._20_4_ * 0.0;
      auVar31._24_4_ = auVar13._24_4_ * 0.0;
      auVar31._28_4_ = auVar163._28_4_;
      auVar85 = vfmadd213ps_fma(ZEXT1632(auVar81),auVar30,local_9a0);
      local_360 = ZEXT1632(CONCAT412(fVar130 * auVar85._12_4_,
                                     CONCAT48(fVar131 * auVar85._8_4_,
                                              CONCAT44(fVar127 * auVar85._4_4_,
                                                       fVar126 * auVar85._0_4_))));
      auVar6._4_4_ = uStack_79c;
      auVar6._0_4_ = local_7a0;
      auVar6._8_4_ = uStack_798;
      auVar6._12_4_ = uStack_794;
      auVar6._16_4_ = uStack_790;
      auVar6._20_4_ = uStack_78c;
      auVar6._24_4_ = uStack_788;
      auVar6._28_4_ = uStack_784;
      auVar13 = vandps_avx(local_860,auVar6);
      auVar13 = vmaxps_avx(local_420,auVar13);
      auVar32._4_4_ = auVar13._4_4_ * 1.9073486e-06;
      auVar32._0_4_ = auVar13._0_4_ * 1.9073486e-06;
      auVar32._8_4_ = auVar13._8_4_ * 1.9073486e-06;
      auVar32._12_4_ = auVar13._12_4_ * 1.9073486e-06;
      auVar32._16_4_ = auVar13._16_4_ * 1.9073486e-06;
      auVar32._20_4_ = auVar13._20_4_ * 1.9073486e-06;
      auVar32._24_4_ = auVar13._24_4_ * 1.9073486e-06;
      auVar32._28_4_ = auVar13._28_4_;
      auVar13 = vandps_avx(auVar12,auVar6);
      auVar13 = vcmpps_avx(auVar13,auVar32,1);
      auVar85 = vfmadd213ps_fma(ZEXT1632(auVar81),auVar31,local_9a0);
      auVar232._8_4_ = 0x7f800000;
      auVar232._0_8_ = 0x7f8000007f800000;
      auVar232._12_4_ = 0x7f800000;
      auVar232._16_4_ = 0x7f800000;
      auVar232._20_4_ = 0x7f800000;
      auVar232._24_4_ = 0x7f800000;
      auVar232._28_4_ = 0x7f800000;
      auVar265 = vblendvps_avx(auVar232,auVar30,auVar164);
      local_380 = auVar85._0_4_ * fVar126;
      fStack_37c = auVar85._4_4_ * fVar127;
      fStack_378 = auVar85._8_4_ * fVar131;
      fStack_374 = auVar85._12_4_ * fVar130;
      uStack_370 = 0;
      uStack_36c = 0;
      uStack_368 = 0;
      uStack_364 = auVar14._28_4_;
      auVar189._8_4_ = 0xff800000;
      auVar189._0_8_ = 0xff800000ff800000;
      auVar189._12_4_ = 0xff800000;
      auVar189._16_4_ = 0xff800000;
      auVar189._20_4_ = 0xff800000;
      auVar189._24_4_ = 0xff800000;
      auVar189._28_4_ = 0xff800000;
      auVar186 = vblendvps_avx(auVar189,auVar31,auVar164);
      auVar163 = auVar164 & auVar13;
      if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar163 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar163 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar163 >> 0x7f,0) != '\0') ||
            (auVar163 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar163 >> 0xbf,0) != '\0') ||
          (auVar163 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar163[0x1f] < '\0') {
        auVar90 = vandps_avx(auVar13,auVar164);
        auVar13 = vcmpps_avx(auVar263,ZEXT832(0) << 0x20,2);
        auVar227 = ZEXT3264(auVar13);
        auVar233._8_4_ = 0xff800000;
        auVar233._0_8_ = 0xff800000ff800000;
        auVar233._12_4_ = 0xff800000;
        auVar233._16_4_ = 0xff800000;
        auVar233._20_4_ = 0xff800000;
        auVar233._24_4_ = 0xff800000;
        auVar233._28_4_ = 0xff800000;
        auVar257._8_4_ = 0x7f800000;
        auVar257._0_8_ = 0x7f8000007f800000;
        auVar257._12_4_ = 0x7f800000;
        auVar257._16_4_ = 0x7f800000;
        auVar257._20_4_ = 0x7f800000;
        auVar257._24_4_ = 0x7f800000;
        auVar257._28_4_ = 0x7f800000;
        auVar263 = vblendvps_avx(auVar257,auVar233,auVar13);
        auVar85 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
        auVar163 = vpmovsxwd_avx2(auVar85);
        auVar265 = vblendvps_avx(auVar265,auVar263,auVar163);
        auVar6 = vblendvps_avx(auVar233,auVar257,auVar13);
        auVar186 = vblendvps_avx(auVar186,auVar6,auVar163);
        auVar100._0_8_ = auVar90._0_8_ ^ 0xffffffffffffffff;
        auVar100._8_4_ = auVar90._8_4_ ^ 0xffffffff;
        auVar100._12_4_ = auVar90._12_4_ ^ 0xffffffff;
        auVar100._16_4_ = auVar90._16_4_ ^ 0xffffffff;
        auVar100._20_4_ = auVar90._20_4_ ^ 0xffffffff;
        auVar100._24_4_ = auVar90._24_4_ ^ 0xffffffff;
        auVar100._28_4_ = auVar90._28_4_ ^ 0xffffffff;
        auVar90 = vorps_avx(auVar13,auVar100);
        auVar90 = vandps_avx(auVar164,auVar90);
      }
    }
    local_3a0 = ZEXT1632(auVar81);
    auVar239 = ZEXT3264(auVar6);
    auVar263 = local_620 & auVar90;
    if ((((((((auVar263 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar263 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar263 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar263 >> 0x7f,0) == '\0') &&
          (auVar263 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar263 >> 0xbf,0) == '\0') &&
        (auVar263 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar263[0x1f])
    {
      auVar262 = ZEXT3264(local_a60);
      auVar255 = ZEXT3264(local_920);
    }
    else {
      fVar213 = (ray->org).field_0.m128[3] - (float)local_820._0_4_;
      auVar94._4_4_ = fVar213;
      auVar94._0_4_ = fVar213;
      auVar94._8_4_ = fVar213;
      auVar94._12_4_ = fVar213;
      auVar94._16_4_ = fVar213;
      auVar94._20_4_ = fVar213;
      auVar94._24_4_ = fVar213;
      auVar94._28_4_ = fVar213;
      auVar13 = vmaxps_avx(auVar94,auVar265);
      fVar213 = ray->tfar - (float)local_820._0_4_;
      auVar203._4_4_ = fVar213;
      auVar203._0_4_ = fVar213;
      auVar203._8_4_ = fVar213;
      auVar203._12_4_ = fVar213;
      auVar203._16_4_ = fVar213;
      auVar203._20_4_ = fVar213;
      auVar203._24_4_ = fVar213;
      auVar203._28_4_ = fVar213;
      auVar164 = vminps_avx(auVar203,auVar186);
      auVar262._0_4_ = (float)local_a80._0_4_ * fVar242;
      auVar262._4_4_ = local_a80._4_4_ * fVar249;
      auVar262._8_4_ = local_a80._8_4_ * fVar170;
      auVar262._12_4_ = local_a80._12_4_ * fVar171;
      auVar262._16_4_ = local_a80._16_4_ * fVar250;
      auVar262._20_4_ = local_a80._20_4_ * fVar251;
      auVar262._28_36_ = SUB4836((undefined1  [48])0x0,0xc);
      auVar262._24_4_ = local_a80._24_4_ * fVar252;
      auVar85 = vfmadd213ps_fma(auVar244,local_980,auVar262._0_32_);
      auVar81 = vfmadd213ps_fma(auVar139,local_6e0,ZEXT1632(auVar85));
      auVar162._0_4_ = local_520 * (float)local_a80._0_4_;
      auVar162._4_4_ = fStack_51c * local_a80._4_4_;
      auVar162._8_4_ = fStack_518 * local_a80._8_4_;
      auVar162._12_4_ = fStack_514 * local_a80._12_4_;
      auVar162._16_4_ = fStack_510 * local_a80._16_4_;
      auVar162._20_4_ = fStack_50c * local_a80._20_4_;
      auVar162._24_4_ = fStack_508 * local_a80._24_4_;
      auVar162._28_4_ = 0;
      auVar85 = vfmadd231ps_fma(auVar162,_local_780,local_980);
      auVar201 = vfmadd231ps_fma(ZEXT1632(auVar85),_local_500,local_6e0);
      auVar53._4_4_ = uStack_79c;
      auVar53._0_4_ = local_7a0;
      auVar53._8_4_ = uStack_798;
      auVar53._12_4_ = uStack_794;
      auVar53._16_4_ = uStack_790;
      auVar53._20_4_ = uStack_78c;
      auVar53._24_4_ = uStack_788;
      auVar53._28_4_ = uStack_784;
      auVar263 = vandps_avx(auVar53,ZEXT1632(auVar201));
      auVar204._8_4_ = 0x219392ef;
      auVar204._0_8_ = 0x219392ef219392ef;
      auVar204._12_4_ = 0x219392ef;
      auVar204._16_4_ = 0x219392ef;
      auVar204._20_4_ = 0x219392ef;
      auVar204._24_4_ = 0x219392ef;
      auVar204._28_4_ = 0x219392ef;
      auVar244 = vcmpps_avx(auVar263,auVar204,1);
      auVar263 = vrcpps_avx(ZEXT1632(auVar201));
      auVar226._8_4_ = 0x3f800000;
      auVar226._0_8_ = 0x3f8000003f800000;
      auVar226._12_4_ = 0x3f800000;
      auVar226._16_4_ = 0x3f800000;
      auVar226._20_4_ = 0x3f800000;
      auVar226._24_4_ = 0x3f800000;
      auVar226._28_4_ = 0x3f800000;
      auVar227 = ZEXT3264(auVar226);
      auVar163 = ZEXT1632(auVar201);
      auVar85 = vfnmadd213ps_fma(auVar263,auVar163,auVar226);
      auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar263,auVar263);
      auVar245._0_4_ = local_660 ^ auVar201._0_4_;
      auVar245._4_4_ = uStack_65c ^ auVar201._4_4_;
      auVar245._8_4_ = uStack_658 ^ auVar201._8_4_;
      auVar245._12_4_ = uStack_654 ^ auVar201._12_4_;
      auVar245._16_4_ = fStack_650;
      auVar245._20_4_ = fStack_64c;
      auVar245._24_4_ = fStack_648;
      auVar245._28_4_ = uStack_644;
      auVar33._4_4_ = auVar85._4_4_ * (float)(auVar81._4_4_ ^ uStack_65c);
      auVar33._0_4_ = auVar85._0_4_ * (float)(auVar81._0_4_ ^ local_660);
      auVar33._8_4_ = auVar85._8_4_ * (float)(auVar81._8_4_ ^ uStack_658);
      auVar33._12_4_ = auVar85._12_4_ * (float)(auVar81._12_4_ ^ uStack_654);
      auVar33._16_4_ = fStack_650 * 0.0;
      auVar33._20_4_ = fStack_64c * 0.0;
      auVar33._24_4_ = fStack_648 * 0.0;
      auVar33._28_4_ = uStack_644;
      auVar263 = vcmpps_avx(auVar163,auVar245,1);
      auVar263 = vorps_avx(auVar244,auVar263);
      auVar267._8_4_ = 0xff800000;
      auVar267._0_8_ = 0xff800000ff800000;
      auVar267._12_4_ = 0xff800000;
      auVar267._16_4_ = 0xff800000;
      auVar267._20_4_ = 0xff800000;
      auVar267._24_4_ = 0xff800000;
      auVar267._28_4_ = 0xff800000;
      auVar263 = vblendvps_avx(auVar33,auVar267,auVar263);
      auVar139 = vmaxps_avx(auVar13,auVar263);
      auVar263 = vcmpps_avx(auVar163,auVar245,6);
      auVar263 = vorps_avx(auVar244,auVar263);
      auVar246._8_4_ = 0x7f800000;
      auVar246._0_8_ = 0x7f8000007f800000;
      auVar246._12_4_ = 0x7f800000;
      auVar246._16_4_ = 0x7f800000;
      auVar246._20_4_ = 0x7f800000;
      auVar246._24_4_ = 0x7f800000;
      auVar246._28_4_ = 0x7f800000;
      auVar247 = ZEXT3264(auVar246);
      auVar263 = vblendvps_avx(auVar33,auVar246,auVar263);
      auVar13 = vminps_avx(auVar164,auVar263);
      fVar213 = (float)(local_660 ^ (uint)local_8a0._0_4_);
      fVar214 = (float)(uStack_65c ^ (uint)local_8a0._4_4_);
      fVar170 = (float)(uStack_658 ^ (uint)local_8a0._8_4_);
      fVar171 = (float)(uStack_654 ^ (uint)local_8a0._12_4_);
      fVar172 = (float)((uint)fStack_650 ^ (uint)local_8a0._16_4_);
      fVar173 = (float)((uint)fStack_64c ^ (uint)local_8a0._20_4_);
      fVar174 = (float)((uint)fStack_648 ^ (uint)local_8a0._24_4_);
      auVar190._0_4_ = local_660 ^ (uint)local_700._0_4_;
      auVar190._4_4_ = uStack_65c ^ (uint)local_700._4_4_;
      auVar190._8_4_ = uStack_658 ^ (uint)local_700._8_4_;
      auVar190._12_4_ = uStack_654 ^ (uint)local_700._12_4_;
      auVar190._16_4_ = (uint)fStack_650 ^ (uint)local_700._16_4_;
      auVar190._20_4_ = (uint)fStack_64c ^ (uint)local_700._20_4_;
      auVar190._24_4_ = (uint)fStack_648 ^ (uint)local_700._24_4_;
      auVar190._28_4_ = uStack_644 ^ local_700._28_4_;
      auVar263 = vsubps_avx(ZEXT832(0) << 0x20,auVar16);
      auVar244 = vsubps_avx(ZEXT832(0) << 0x20,local_960);
      auVar34._4_4_ = auVar244._4_4_ * fVar214;
      auVar34._0_4_ = auVar244._0_4_ * fVar213;
      auVar34._8_4_ = auVar244._8_4_ * fVar170;
      auVar34._12_4_ = auVar244._12_4_ * fVar171;
      auVar34._16_4_ = auVar244._16_4_ * fVar172;
      auVar34._20_4_ = auVar244._20_4_ * fVar173;
      auVar34._24_4_ = auVar244._24_4_ * fVar174;
      auVar34._28_4_ = auVar244._28_4_;
      auVar85 = vfmadd231ps_fma(auVar34,auVar190,auVar263);
      auVar205._0_4_ = local_660 ^ (uint)local_aa0._0_4_;
      auVar205._4_4_ = uStack_65c ^ (uint)local_aa0._4_4_;
      auVar205._8_4_ = uStack_658 ^ (uint)local_aa0._8_4_;
      auVar205._12_4_ = uStack_654 ^ (uint)local_aa0._12_4_;
      auVar205._16_4_ = (uint)fStack_650 ^ (uint)local_aa0._16_4_;
      auVar205._20_4_ = (uint)fStack_64c ^ (uint)local_aa0._20_4_;
      auVar205._24_4_ = (uint)fStack_648 ^ (uint)local_aa0._24_4_;
      auVar205._28_4_ = uStack_644 ^ local_aa0._28_4_;
      auVar263 = vsubps_avx(ZEXT832(0) << 0x20,auVar15);
      auVar81 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar205,auVar263);
      auVar35._4_4_ = fStack_51c * fVar214;
      auVar35._0_4_ = local_520 * fVar213;
      auVar35._8_4_ = fStack_518 * fVar170;
      auVar35._12_4_ = fStack_514 * fVar171;
      auVar35._16_4_ = fStack_510 * fVar172;
      auVar35._20_4_ = fStack_50c * fVar173;
      auVar35._24_4_ = fStack_508 * fVar174;
      auVar35._28_4_ = uStack_644 ^ local_8a0._28_4_;
      auVar85 = vfmadd231ps_fma(auVar35,auVar190,_local_780);
      auVar201 = vfmadd231ps_fma(ZEXT1632(auVar85),_local_500,auVar205);
      auVar263 = vandps_avx(auVar53,ZEXT1632(auVar201));
      auVar15 = vrcpps_avx(ZEXT1632(auVar201));
      auVar238._8_4_ = 0x219392ef;
      auVar238._0_8_ = 0x219392ef219392ef;
      auVar238._12_4_ = 0x219392ef;
      auVar238._16_4_ = 0x219392ef;
      auVar238._20_4_ = 0x219392ef;
      auVar238._24_4_ = 0x219392ef;
      auVar238._28_4_ = 0x219392ef;
      auVar244 = vcmpps_avx(auVar263,auVar238,1);
      auVar164 = ZEXT1632(auVar201);
      auVar85 = vfnmadd213ps_fma(auVar15,auVar164,auVar226);
      auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar15,auVar15);
      auVar206._0_4_ = local_660 ^ auVar201._0_4_;
      auVar206._4_4_ = uStack_65c ^ auVar201._4_4_;
      auVar206._8_4_ = uStack_658 ^ auVar201._8_4_;
      auVar206._12_4_ = uStack_654 ^ auVar201._12_4_;
      auVar206._16_4_ = fStack_650;
      auVar206._20_4_ = fStack_64c;
      auVar206._24_4_ = fStack_648;
      auVar206._28_4_ = uStack_644;
      auVar36._4_4_ = auVar85._4_4_ * (float)(uStack_65c ^ auVar81._4_4_);
      auVar36._0_4_ = auVar85._0_4_ * (float)(local_660 ^ auVar81._0_4_);
      auVar36._8_4_ = auVar85._8_4_ * (float)(uStack_658 ^ auVar81._8_4_);
      auVar36._12_4_ = auVar85._12_4_ * (float)(uStack_654 ^ auVar81._12_4_);
      auVar36._16_4_ = fStack_650 * 0.0;
      auVar36._20_4_ = fStack_64c * 0.0;
      auVar36._24_4_ = fStack_648 * 0.0;
      auVar36._28_4_ = uStack_644;
      auVar263 = vcmpps_avx(auVar164,auVar206,1);
      auVar263 = vorps_avx(auVar263,auVar244);
      auVar263 = vblendvps_avx(auVar36,auVar267,auVar263);
      auVar239 = ZEXT3264(auVar263);
      _local_640 = vmaxps_avx(auVar139,auVar263);
      auVar263 = vcmpps_avx(auVar164,auVar206,6);
      auVar263 = vorps_avx(auVar244,auVar263);
      auVar263 = vblendvps_avx(auVar36,auVar246,auVar263);
      auVar90 = vandps_avx(local_620,auVar90);
      local_480 = vminps_avx(auVar13,auVar263);
      auVar263 = vcmpps_avx(_local_640,local_480,2);
      auVar244 = auVar90 & auVar263;
      if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar244 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar244 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar244 >> 0x7f,0) == '\0') &&
            (auVar244 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar244 >> 0xbf,0) == '\0') &&
          (auVar244 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar244[0x1f]) {
        auVar262 = ZEXT3264(local_a60);
        auVar255 = ZEXT3264(local_920);
      }
      else {
        auVar207._8_4_ = 0x3f800000;
        auVar207._0_8_ = 0x3f8000003f800000;
        auVar207._12_4_ = 0x3f800000;
        auVar207._16_4_ = 0x3f800000;
        auVar207._20_4_ = 0x3f800000;
        auVar207._24_4_ = 0x3f800000;
        auVar207._28_4_ = 0x3f800000;
        auVar244 = vminps_avx(local_360,auVar207);
        auVar244 = vmaxps_avx(auVar244,ZEXT832(0) << 0x20);
        auVar58._4_4_ = fStack_37c;
        auVar58._0_4_ = local_380;
        auVar58._8_4_ = fStack_378;
        auVar58._12_4_ = fStack_374;
        auVar58._16_4_ = uStack_370;
        auVar58._20_4_ = uStack_36c;
        auVar58._24_4_ = uStack_368;
        auVar58._28_4_ = uStack_364;
        auVar139 = vminps_avx(auVar58,auVar207);
        auVar139 = vmaxps_avx(auVar139,ZEXT832(0) << 0x20);
        auVar37._4_4_ = (auVar244._4_4_ + 1.0) * 0.125;
        auVar37._0_4_ = (auVar244._0_4_ + 0.0) * 0.125;
        auVar37._8_4_ = (auVar244._8_4_ + 2.0) * 0.125;
        auVar37._12_4_ = (auVar244._12_4_ + 3.0) * 0.125;
        auVar37._16_4_ = (auVar244._16_4_ + 4.0) * 0.125;
        auVar37._20_4_ = (auVar244._20_4_ + 5.0) * 0.125;
        auVar37._24_4_ = (auVar244._24_4_ + 6.0) * 0.125;
        auVar37._28_4_ = auVar244._28_4_ + 7.0;
        auVar85 = vfmadd213ps_fma(auVar37,local_740,local_720);
        auVar38._4_4_ = (auVar139._4_4_ + 1.0) * 0.125;
        auVar38._0_4_ = (auVar139._0_4_ + 0.0) * 0.125;
        auVar38._8_4_ = (auVar139._8_4_ + 2.0) * 0.125;
        auVar38._12_4_ = (auVar139._12_4_ + 3.0) * 0.125;
        auVar38._16_4_ = (auVar139._16_4_ + 4.0) * 0.125;
        auVar38._20_4_ = (auVar139._20_4_ + 5.0) * 0.125;
        auVar38._24_4_ = (auVar139._24_4_ + 6.0) * 0.125;
        auVar38._28_4_ = auVar139._28_4_ + 7.0;
        auVar81 = vfmadd213ps_fma(auVar38,local_740,local_720);
        auVar244 = vminps_avx(auVar231,auVar161);
        auVar139 = vminps_avx(auVar17,auVar18);
        auVar244 = vminps_avx(auVar244,auVar139);
        auVar138 = vsubps_avx(auVar244,auVar138);
        local_940 = vandps_avx(auVar263,auVar90);
        local_1a0 = ZEXT1632(auVar85);
        local_1c0 = ZEXT1632(auVar81);
        auVar39._4_4_ = auVar138._4_4_ * 0.99999976;
        auVar39._0_4_ = auVar138._0_4_ * 0.99999976;
        auVar39._8_4_ = auVar138._8_4_ * 0.99999976;
        auVar39._12_4_ = auVar138._12_4_ * 0.99999976;
        auVar39._16_4_ = auVar138._16_4_ * 0.99999976;
        auVar39._20_4_ = auVar138._20_4_ * 0.99999976;
        auVar39._24_4_ = auVar138._24_4_ * 0.99999976;
        auVar39._28_4_ = 0x3f7ffffc;
        auVar90 = vmaxps_avx(ZEXT832(0) << 0x20,auVar39);
        auVar40._4_4_ = auVar90._4_4_ * auVar90._4_4_;
        auVar40._0_4_ = auVar90._0_4_ * auVar90._0_4_;
        auVar40._8_4_ = auVar90._8_4_ * auVar90._8_4_;
        auVar40._12_4_ = auVar90._12_4_ * auVar90._12_4_;
        auVar40._16_4_ = auVar90._16_4_ * auVar90._16_4_;
        auVar40._20_4_ = auVar90._20_4_ * auVar90._20_4_;
        auVar40._24_4_ = auVar90._24_4_ * auVar90._24_4_;
        auVar40._28_4_ = auVar90._28_4_;
        auVar263 = vsubps_avx(auVar165,auVar40);
        auVar239 = ZEXT3264(auVar263);
        auVar41._4_4_ = auVar263._4_4_ * fVar129 * 4.0;
        auVar41._0_4_ = auVar263._0_4_ * fVar128 * 4.0;
        auVar41._8_4_ = auVar263._8_4_ * fVar192 * 4.0;
        auVar41._12_4_ = auVar263._12_4_ * fVar209 * 4.0;
        auVar41._16_4_ = auVar263._16_4_ * fVar210 * 4.0;
        auVar41._20_4_ = auVar263._20_4_ * fVar211 * 4.0;
        auVar41._24_4_ = auVar263._24_4_ * fVar212 * 4.0;
        auVar41._28_4_ = auVar90._28_4_;
        auVar244 = vsubps_avx(auVar28,auVar41);
        auVar51 = ZEXT412(0);
        auVar139 = ZEXT1232(auVar51) << 0x20;
        local_7e0 = ZEXT1232(auVar51) << 0x20;
        _local_880 = vcmpps_avx(auVar244,ZEXT832(0) << 0x20,5);
        auVar255 = ZEXT3264(local_920);
        auVar90 = _local_880;
        if ((((((((_local_880 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (_local_880 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (_local_880 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(_local_880 >> 0x7f,0) == '\0') &&
              (_local_880 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(_local_880 >> 0xbf,0) == '\0') &&
            (_local_880 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_880[0x1f]) {
          _local_800 = ZEXT1232(auVar51) << 0x20;
          auVar165 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar183 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar208._8_4_ = 0x7f800000;
          auVar208._0_8_ = 0x7f8000007f800000;
          auVar208._12_4_ = 0x7f800000;
          auVar208._16_4_ = 0x7f800000;
          auVar208._20_4_ = 0x7f800000;
          auVar208._24_4_ = 0x7f800000;
          auVar208._28_4_ = 0x7f800000;
          auVar217._8_4_ = 0xff800000;
          auVar217._0_8_ = 0xff800000ff800000;
          auVar217._12_4_ = 0xff800000;
          auVar217._16_4_ = 0xff800000;
          auVar217._20_4_ = 0xff800000;
          auVar217._24_4_ = 0xff800000;
          auVar217._28_4_ = 0xff800000;
          _local_880 = auVar16;
          _local_7c0 = local_7e0;
        }
        else {
          auVar165 = vsqrtps_avx(auVar244);
          auVar166._0_4_ = fVar128 + fVar128;
          auVar166._4_4_ = fVar129 + fVar129;
          auVar166._8_4_ = fVar192 + fVar192;
          auVar166._12_4_ = fVar209 + fVar209;
          auVar166._16_4_ = fVar210 + fVar210;
          auVar166._20_4_ = fVar211 + fVar211;
          auVar166._24_4_ = fVar212 + fVar212;
          auVar166._28_4_ = fVar103 + fVar103;
          auVar139 = vrcpps_avx(auVar166);
          auVar119._8_4_ = 0x3f800000;
          auVar119._0_8_ = 0x3f8000003f800000;
          auVar119._12_4_ = 0x3f800000;
          auVar119._16_4_ = 0x3f800000;
          auVar119._20_4_ = 0x3f800000;
          auVar119._24_4_ = 0x3f800000;
          auVar119._28_4_ = 0x3f800000;
          auVar85 = vfnmadd213ps_fma(auVar166,auVar139,auVar119);
          auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar139,auVar139);
          auVar191._0_4_ = (uint)auVar236._0_4_ ^ local_660;
          auVar191._4_4_ = (uint)auVar236._4_4_ ^ uStack_65c;
          auVar191._8_4_ = (uint)auVar236._8_4_ ^ uStack_658;
          auVar191._12_4_ = (uint)auVar236._12_4_ ^ uStack_654;
          auVar191._16_4_ = (uint)auVar236._16_4_ ^ (uint)fStack_650;
          auVar191._20_4_ = (uint)auVar236._20_4_ ^ (uint)fStack_64c;
          auVar191._24_4_ = (uint)auVar236._24_4_ ^ (uint)fStack_648;
          auVar191._28_4_ = (uint)auVar236._28_4_ ^ uStack_644;
          auVar139 = vsubps_avx(auVar191,auVar165);
          auVar165 = vsubps_avx(auVar165,auVar236);
          fVar103 = auVar139._0_4_ * auVar85._0_4_;
          fVar128 = auVar139._4_4_ * auVar85._4_4_;
          auVar42._4_4_ = fVar128;
          auVar42._0_4_ = fVar103;
          fVar129 = auVar139._8_4_ * auVar85._8_4_;
          auVar42._8_4_ = fVar129;
          fVar192 = auVar139._12_4_ * auVar85._12_4_;
          auVar42._12_4_ = fVar192;
          fVar209 = auVar139._16_4_ * 0.0;
          auVar42._16_4_ = fVar209;
          fVar210 = auVar139._20_4_ * 0.0;
          auVar42._20_4_ = fVar210;
          fVar211 = auVar139._24_4_ * 0.0;
          auVar42._24_4_ = fVar211;
          auVar42._28_4_ = auVar138._28_4_;
          fVar212 = auVar165._0_4_ * auVar85._0_4_;
          fVar213 = auVar165._4_4_ * auVar85._4_4_;
          auVar43._4_4_ = fVar213;
          auVar43._0_4_ = fVar212;
          fVar214 = auVar165._8_4_ * auVar85._8_4_;
          auVar43._8_4_ = fVar214;
          fVar170 = auVar165._12_4_ * auVar85._12_4_;
          auVar43._12_4_ = fVar170;
          fVar171 = auVar165._16_4_ * 0.0;
          auVar43._16_4_ = fVar171;
          fVar172 = auVar165._20_4_ * 0.0;
          auVar43._20_4_ = fVar172;
          fVar173 = auVar165._24_4_ * 0.0;
          auVar43._24_4_ = fVar173;
          auVar43._28_4_ = fStack_504;
          auVar85 = vfmadd213ps_fma(local_3a0,auVar42,local_9a0);
          auVar81 = vfmadd213ps_fma(local_3a0,auVar43,local_9a0);
          auVar44._28_4_ = auVar139._28_4_;
          auVar44._0_28_ =
               ZEXT1628(CONCAT412(fVar130 * auVar85._12_4_,
                                  CONCAT48(fVar131 * auVar85._8_4_,
                                           CONCAT44(fVar127 * auVar85._4_4_,fVar126 * auVar85._0_4_)
                                          )));
          auVar138 = ZEXT1632(CONCAT412(fVar130 * auVar81._12_4_,
                                        CONCAT48(fVar131 * auVar81._8_4_,
                                                 CONCAT44(fVar127 * auVar81._4_4_,
                                                          fVar126 * auVar81._0_4_))));
          auVar85 = vfmadd213ps_fma(auVar10,auVar44,local_ac0);
          auVar81 = vfmadd213ps_fma(auVar10,auVar138,local_ac0);
          auVar201 = vfmadd213ps_fma(_local_5e0,auVar44,auVar91);
          auVar223 = vfmadd213ps_fma(_local_5e0,auVar138,auVar91);
          auVar7 = vfmadd213ps_fma(auVar44,auVar11,auVar264);
          auVar78 = vfmadd213ps_fma(auVar11,auVar138,auVar264);
          auVar45._4_4_ = (float)local_500._4_4_ * fVar128;
          auVar45._0_4_ = (float)local_500._0_4_ * fVar103;
          auVar45._8_4_ = fStack_4f8 * fVar129;
          auVar45._12_4_ = fStack_4f4 * fVar192;
          auVar45._16_4_ = fStack_4f0 * fVar209;
          auVar45._20_4_ = fStack_4ec * fVar210;
          auVar45._24_4_ = fStack_4e8 * fVar211;
          auVar45._28_4_ = 0;
          auVar139 = vsubps_avx(auVar45,ZEXT1632(auVar85));
          auVar167._0_4_ = (float)local_780._0_4_ * fVar103;
          auVar167._4_4_ = (float)local_780._4_4_ * fVar128;
          auVar167._8_4_ = fStack_778 * fVar129;
          auVar167._12_4_ = fStack_774 * fVar192;
          auVar167._16_4_ = fStack_770 * fVar209;
          auVar167._20_4_ = fStack_76c * fVar210;
          auVar167._24_4_ = fStack_768 * fVar211;
          auVar167._28_4_ = 0;
          auVar165 = vsubps_avx(auVar167,ZEXT1632(auVar201));
          auVar218._0_4_ = local_520 * fVar103;
          auVar218._4_4_ = fStack_51c * fVar128;
          auVar218._8_4_ = fStack_518 * fVar129;
          auVar218._12_4_ = fStack_514 * fVar192;
          auVar218._16_4_ = fStack_510 * fVar209;
          auVar218._20_4_ = fStack_50c * fVar210;
          auVar218._24_4_ = fStack_508 * fVar211;
          auVar218._28_4_ = 0;
          auVar138 = vsubps_avx(auVar218,ZEXT1632(auVar7));
          auVar183 = auVar138._0_28_;
          auVar46._4_4_ = (float)local_500._4_4_ * fVar213;
          auVar46._0_4_ = (float)local_500._0_4_ * fVar212;
          auVar46._8_4_ = fStack_4f8 * fVar214;
          auVar46._12_4_ = fStack_4f4 * fVar170;
          auVar46._16_4_ = fStack_4f0 * fVar171;
          auVar46._20_4_ = fStack_4ec * fVar172;
          auVar46._24_4_ = fStack_4e8 * fVar173;
          auVar46._28_4_ = 0;
          _local_7c0 = vsubps_avx(auVar46,ZEXT1632(auVar81));
          auVar47._4_4_ = fVar213 * (float)local_780._4_4_;
          auVar47._0_4_ = fVar212 * (float)local_780._0_4_;
          auVar47._8_4_ = fVar214 * fStack_778;
          auVar47._12_4_ = fVar170 * fStack_774;
          auVar47._16_4_ = fVar171 * fStack_770;
          auVar47._20_4_ = fVar172 * fStack_76c;
          auVar47._24_4_ = fVar173 * fStack_768;
          auVar47._28_4_ = local_7c0._28_4_;
          local_7e0 = vsubps_avx(auVar47,ZEXT1632(auVar223));
          auVar48._4_4_ = fStack_51c * fVar213;
          auVar48._0_4_ = local_520 * fVar212;
          auVar48._8_4_ = fStack_518 * fVar214;
          auVar48._12_4_ = fStack_514 * fVar170;
          auVar48._16_4_ = fStack_510 * fVar171;
          auVar48._20_4_ = fStack_50c * fVar172;
          auVar48._24_4_ = fStack_508 * fVar173;
          auVar48._28_4_ = local_7e0._28_4_;
          _local_800 = vsubps_avx(auVar48,ZEXT1632(auVar78));
          auVar244 = vcmpps_avx(auVar244,_DAT_01faff00,5);
          auVar219._8_4_ = 0x7f800000;
          auVar219._0_8_ = 0x7f8000007f800000;
          auVar219._12_4_ = 0x7f800000;
          auVar219._16_4_ = 0x7f800000;
          auVar219._20_4_ = 0x7f800000;
          auVar219._24_4_ = 0x7f800000;
          auVar219._28_4_ = 0x7f800000;
          auVar208 = vblendvps_avx(auVar219,auVar42,auVar244);
          auVar54._4_4_ = uStack_79c;
          auVar54._0_4_ = local_7a0;
          auVar54._8_4_ = uStack_798;
          auVar54._12_4_ = uStack_794;
          auVar54._16_4_ = uStack_790;
          auVar54._20_4_ = uStack_78c;
          auVar54._24_4_ = uStack_788;
          auVar54._28_4_ = uStack_784;
          auVar138 = vandps_avx(auVar54,local_860);
          auVar138 = vmaxps_avx(local_420,auVar138);
          auVar49._4_4_ = auVar138._4_4_ * 1.9073486e-06;
          auVar49._0_4_ = auVar138._0_4_ * 1.9073486e-06;
          auVar49._8_4_ = auVar138._8_4_ * 1.9073486e-06;
          auVar49._12_4_ = auVar138._12_4_ * 1.9073486e-06;
          auVar49._16_4_ = auVar138._16_4_ * 1.9073486e-06;
          auVar49._20_4_ = auVar138._20_4_ * 1.9073486e-06;
          auVar49._24_4_ = auVar138._24_4_ * 1.9073486e-06;
          auVar49._28_4_ = auVar138._28_4_;
          auVar138 = vandps_avx(auVar54,auVar12);
          auVar138 = vcmpps_avx(auVar138,auVar49,1);
          auVar220._8_4_ = 0xff800000;
          auVar220._0_8_ = 0xff800000ff800000;
          auVar220._12_4_ = 0xff800000;
          auVar220._16_4_ = 0xff800000;
          auVar220._20_4_ = 0xff800000;
          auVar220._24_4_ = 0xff800000;
          auVar220._28_4_ = 0xff800000;
          auVar217 = vblendvps_avx(auVar220,auVar43,auVar244);
          auVar12 = auVar244 & auVar138;
          if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar12 >> 0x7f,0) != '\0') ||
                (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar12 >> 0xbf,0) != '\0') ||
              (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar12[0x1f] < '\0') {
            auVar90 = vandps_avx(auVar138,auVar244);
            auVar138 = vcmpps_avx(auVar263,ZEXT832(0) << 0x20,2);
            auVar239 = ZEXT3264(auVar138);
            auVar124._8_4_ = 0xff800000;
            auVar124._0_8_ = 0xff800000ff800000;
            auVar124._12_4_ = 0xff800000;
            auVar124._16_4_ = 0xff800000;
            auVar124._20_4_ = 0xff800000;
            auVar124._24_4_ = 0xff800000;
            auVar124._28_4_ = 0xff800000;
            auVar258._8_4_ = 0x7f800000;
            auVar258._0_8_ = 0x7f8000007f800000;
            auVar258._12_4_ = 0x7f800000;
            auVar258._16_4_ = 0x7f800000;
            auVar258._20_4_ = 0x7f800000;
            auVar258._24_4_ = 0x7f800000;
            auVar258._28_4_ = 0x7f800000;
            auVar263 = vblendvps_avx(auVar258,auVar124,auVar138);
            auVar85 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
            auVar12 = vpmovsxwd_avx2(auVar85);
            auVar208 = vblendvps_avx(auVar208,auVar263,auVar12);
            auVar263 = vblendvps_avx(auVar124,auVar258,auVar138);
            auVar217 = vblendvps_avx(auVar217,auVar263,auVar12);
            auVar234._0_8_ = auVar90._0_8_ ^ 0xffffffffffffffff;
            auVar234._8_4_ = auVar90._8_4_ ^ 0xffffffff;
            auVar234._12_4_ = auVar90._12_4_ ^ 0xffffffff;
            auVar234._16_4_ = auVar90._16_4_ ^ 0xffffffff;
            auVar234._20_4_ = auVar90._20_4_ ^ 0xffffffff;
            auVar234._24_4_ = auVar90._24_4_ ^ 0xffffffff;
            auVar234._28_4_ = auVar90._28_4_ ^ 0xffffffff;
            auVar90 = vorps_avx(auVar138,auVar234);
            auVar90 = vandps_avx(auVar90,auVar244);
          }
        }
        auVar262 = ZEXT3264(local_a60);
        uVar73 = *(undefined4 *)&(ray->dir).field_0;
        local_5a0._4_4_ = uVar73;
        local_5a0._0_4_ = uVar73;
        local_5a0._8_4_ = uVar73;
        local_5a0._12_4_ = uVar73;
        local_5a0._16_4_ = uVar73;
        local_5a0._20_4_ = uVar73;
        local_5a0._24_4_ = uVar73;
        local_5a0._28_4_ = uVar73;
        uVar73 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
        local_5c0._4_4_ = uVar73;
        local_5c0._0_4_ = uVar73;
        local_5c0._8_4_ = uVar73;
        local_5c0._12_4_ = uVar73;
        local_5c0._16_4_ = uVar73;
        local_5c0._20_4_ = uVar73;
        local_5c0._24_4_ = uVar73;
        local_5c0._28_4_ = uVar73;
        auVar247 = ZEXT3264(local_5c0);
        fVar103 = (ray->dir).field_0.m128[2];
        auVar227 = ZEXT3264(_local_640);
        local_460 = _local_640;
        local_440 = vminps_avx(local_480,auVar208);
        local_680 = vmaxps_avx(_local_640,auVar217);
        local_4a0 = local_680;
        auVar263 = vcmpps_avx(_local_640,local_440,2);
        local_540 = vandps_avx(auVar263,local_940);
        auVar263 = vcmpps_avx(local_680,local_480,2);
        local_6a0 = vandps_avx(auVar263,local_940);
        auVar263 = vorps_avx(local_6a0,local_540);
        if ((((((((auVar263 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar263 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar263 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar263 >> 0x7f,0) != '\0') ||
              (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar263 >> 0xbf,0) != '\0') ||
            (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar263[0x1f] < '\0') {
          local_600._0_8_ = auVar90._0_8_ ^ 0xffffffffffffffff;
          local_600._8_4_ = auVar90._8_4_ ^ 0xffffffff;
          local_600._12_4_ = auVar90._12_4_ ^ 0xffffffff;
          local_600._16_4_ = auVar90._16_4_ ^ 0xffffffff;
          local_600._20_4_ = auVar90._20_4_ ^ 0xffffffff;
          local_600._24_4_ = auVar90._24_4_ ^ 0xffffffff;
          local_600._28_4_ = auVar90._28_4_ ^ 0xffffffff;
          auVar50._4_4_ = fVar103 * auVar183._4_4_;
          auVar50._0_4_ = fVar103 * auVar183._0_4_;
          auVar50._8_4_ = fVar103 * auVar183._8_4_;
          auVar50._12_4_ = fVar103 * auVar183._12_4_;
          auVar50._16_4_ = fVar103 * auVar183._16_4_;
          auVar50._20_4_ = fVar103 * auVar183._20_4_;
          auVar50._24_4_ = fVar103 * auVar183._24_4_;
          auVar50._28_4_ = auVar263._28_4_;
          auVar85 = vfmadd213ps_fma(auVar165,local_5c0,auVar50);
          auVar85 = vfmadd213ps_fma(auVar139,local_5a0,ZEXT1632(auVar85));
          auVar55._4_4_ = uStack_79c;
          auVar55._0_4_ = local_7a0;
          auVar55._8_4_ = uStack_798;
          auVar55._12_4_ = uStack_794;
          auVar55._16_4_ = uStack_790;
          auVar55._20_4_ = uStack_78c;
          auVar55._24_4_ = uStack_788;
          auVar55._28_4_ = uStack_784;
          auVar90 = vandps_avx(ZEXT1632(auVar85),auVar55);
          auVar120._8_4_ = 0x3e99999a;
          auVar120._0_8_ = 0x3e99999a3e99999a;
          auVar120._12_4_ = 0x3e99999a;
          auVar120._16_4_ = 0x3e99999a;
          auVar120._20_4_ = 0x3e99999a;
          auVar120._24_4_ = 0x3e99999a;
          auVar120._28_4_ = 0x3e99999a;
          auVar90 = vcmpps_avx(auVar90,auVar120,1);
          auVar90 = vorps_avx(auVar90,local_600);
          auVar121._8_4_ = 3;
          auVar121._0_8_ = 0x300000003;
          auVar121._12_4_ = 3;
          auVar121._16_4_ = 3;
          auVar121._20_4_ = 3;
          auVar121._24_4_ = 3;
          auVar121._28_4_ = 3;
          auVar140._8_4_ = 2;
          auVar140._0_8_ = 0x200000002;
          auVar140._12_4_ = 2;
          auVar140._16_4_ = 2;
          auVar140._20_4_ = 2;
          auVar140._24_4_ = 2;
          auVar140._28_4_ = 2;
          auVar90 = vblendvps_avx(auVar140,auVar121,auVar90);
          local_580._4_4_ = local_b44;
          local_580._0_4_ = local_b44;
          local_580._8_4_ = local_b44;
          local_580._12_4_ = local_b44;
          local_580._16_4_ = local_b44;
          local_580._20_4_ = local_b44;
          local_580._24_4_ = local_b44;
          local_580._28_4_ = local_b44;
          local_560 = vpcmpgtd_avx2(auVar90,local_580);
          local_4e0 = vpandn_avx2(local_560,local_540);
          auVar227 = ZEXT3264(local_4e0);
          auVar90 = local_540 & ~local_560;
          if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar90 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar90 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar90 >> 0x7f,0) == '\0') &&
                (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar90 >> 0xbf,0) == '\0') &&
              (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar90[0x1f]) {
            fVar126 = ray->tfar;
            auVar95._4_4_ = fVar126;
            auVar95._0_4_ = fVar126;
            auVar95._8_4_ = fVar126;
            auVar95._12_4_ = fVar126;
            auVar95._16_4_ = fVar126;
            auVar95._20_4_ = fVar126;
            auVar95._24_4_ = fVar126;
            auVar95._28_4_ = fVar126;
            auVar90 = local_600;
            auVar263 = local_5a0;
            fVar126 = fVar103;
            fVar127 = fVar103;
            fVar128 = fVar103;
            fVar131 = fVar103;
            fVar129 = fVar103;
            fVar130 = fVar103;
            local_600 = auVar236;
            local_5c0 = auVar10;
            local_5a0 = auVar11;
          }
          else {
            local_5e0._4_4_ = fVar103;
            local_5e0._0_4_ = fVar103;
            fStack_5d8 = fVar103;
            fStack_5d4 = fVar103;
            fStack_5d0 = fVar103;
            fStack_5cc = fVar103;
            fStack_5c8 = fVar103;
            fStack_5c4 = fVar103;
            auVar81 = vminps_avx(local_a00,local_a20);
            auVar85 = vmaxps_avx(local_a00,local_a20);
            auVar201 = vminps_avx(local_a10,_local_a30);
            auVar223 = vminps_avx(auVar81,auVar201);
            auVar81 = vmaxps_avx(local_a10,_local_a30);
            auVar201 = vmaxps_avx(auVar85,auVar81);
            auVar85 = vandps_avx(auVar223,local_a40);
            auVar81 = vandps_avx(auVar201,local_a40);
            auVar85 = vmaxps_avx(auVar85,auVar81);
            auVar81 = vmovshdup_avx(auVar85);
            auVar81 = vmaxss_avx(auVar81,auVar85);
            auVar85 = vshufpd_avx(auVar85,auVar85,1);
            auVar85 = vmaxss_avx(auVar85,auVar81);
            local_940._0_4_ = auVar85._0_4_ * 1.9073486e-06;
            auVar85 = vshufps_avx(auVar201,auVar201,0xff);
            local_760 = ZEXT1632(auVar85);
            local_9c0._4_4_ = (float)local_640._4_4_ + (float)local_840._4_4_;
            local_9c0._0_4_ = (float)local_640._0_4_ + (float)local_840._0_4_;
            fStack_9b8 = fStack_638 + fStack_838;
            fStack_9b4 = fStack_634 + fStack_834;
            fStack_9b0 = fStack_630 + fStack_830;
            fStack_9ac = fStack_62c + fStack_82c;
            fStack_9a8 = fStack_628 + fStack_828;
            fStack_9a4 = fStack_624 + fStack_824;
            do {
              auVar96._8_4_ = 0x7f800000;
              auVar96._0_8_ = 0x7f8000007f800000;
              auVar96._12_4_ = 0x7f800000;
              auVar96._16_4_ = 0x7f800000;
              auVar96._20_4_ = 0x7f800000;
              auVar96._24_4_ = 0x7f800000;
              auVar96._28_4_ = 0x7f800000;
              auVar90 = auVar227._0_32_;
              auVar263 = vblendvps_avx(auVar96,_local_640,auVar90);
              auVar138 = vshufps_avx(auVar263,auVar263,0xb1);
              auVar138 = vminps_avx(auVar263,auVar138);
              auVar244 = vshufpd_avx(auVar138,auVar138,5);
              auVar138 = vminps_avx(auVar138,auVar244);
              auVar244 = vpermpd_avx2(auVar138,0x4e);
              auVar138 = vminps_avx(auVar138,auVar244);
              auVar263 = vcmpps_avx(auVar263,auVar138,0);
              auVar138 = auVar90 & auVar263;
              if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar138 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar138 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar138 >> 0x7f,0) != '\0') ||
                    (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar138 >> 0xbf,0) != '\0') ||
                  (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar138[0x1f] < '\0') {
                auVar90 = vandps_avx(auVar263,auVar90);
              }
              uVar66 = vmovmskps_avx(auVar90);
              iVar19 = 0;
              for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
                iVar19 = iVar19 + 1;
              }
              uVar67 = iVar19 << 2;
              *(undefined4 *)(local_4e0 + uVar67) = 0;
              aVar1 = (ray->dir).field_0;
              local_9a0._0_16_ = (undefined1  [16])aVar1;
              auVar85 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
              uVar66 = *(uint *)(local_1a0 + uVar67);
              if (auVar85._0_4_ < 0.0) {
                local_ac0._0_16_ = ZEXT416(*(uint *)(local_460 + uVar67));
                fVar103 = sqrtf(auVar85._0_4_);
                auVar85 = local_ac0._0_16_;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
                fVar103 = auVar85._0_4_;
                auVar85 = ZEXT416(*(uint *)(local_460 + uVar67));
              }
              local_700._0_4_ = fVar103 * 1.9073486e-06;
              auVar85 = vinsertps_avx(auVar85,ZEXT416(uVar66),0x10);
              bVar72 = true;
              uVar68 = 0;
              do {
                local_960._0_16_ = vmovshdup_avx(auVar85);
                fVar131 = 1.0 - local_960._0_4_;
                auVar81 = vshufps_avx(auVar85,auVar85,0x55);
                fVar103 = auVar81._0_4_;
                auVar107._0_4_ = local_a20._0_4_ * fVar103;
                fVar126 = auVar81._4_4_;
                auVar107._4_4_ = local_a20._4_4_ * fVar126;
                fVar127 = auVar81._8_4_;
                auVar107._8_4_ = local_a20._8_4_ * fVar127;
                fVar128 = auVar81._12_4_;
                auVar107._12_4_ = local_a20._12_4_ * fVar128;
                auVar133._4_4_ = fVar131;
                auVar133._0_4_ = fVar131;
                auVar133._8_4_ = fVar131;
                auVar133._12_4_ = fVar131;
                auVar81 = vfmadd231ps_fma(auVar107,auVar133,local_a00);
                auVar147._0_4_ = local_a10._0_4_ * fVar103;
                auVar147._4_4_ = local_a10._4_4_ * fVar126;
                auVar147._8_4_ = local_a10._8_4_ * fVar127;
                auVar147._12_4_ = local_a10._12_4_ * fVar128;
                auVar201 = vfmadd231ps_fma(auVar147,auVar133,local_a20);
                auVar198._0_4_ = fVar103 * auVar201._0_4_;
                auVar198._4_4_ = fVar126 * auVar201._4_4_;
                auVar198._8_4_ = fVar127 * auVar201._8_4_;
                auVar198._12_4_ = fVar128 * auVar201._12_4_;
                auVar223 = vfmadd231ps_fma(auVar198,auVar133,auVar81);
                auVar108._0_4_ = fVar103 * (float)local_a30._0_4_;
                auVar108._4_4_ = fVar126 * (float)local_a30._4_4_;
                auVar108._8_4_ = fVar127 * fStack_a28;
                auVar108._12_4_ = fVar128 * fStack_a24;
                auVar81 = vfmadd231ps_fma(auVar108,auVar133,local_a10);
                auVar177._0_4_ = fVar103 * auVar81._0_4_;
                auVar177._4_4_ = fVar126 * auVar81._4_4_;
                auVar177._8_4_ = fVar127 * auVar81._8_4_;
                auVar177._12_4_ = fVar128 * auVar81._12_4_;
                local_aa0._0_16_ = vfmadd231ps_fma(auVar177,auVar133,auVar201);
                fVar129 = auVar85._0_4_;
                auVar109._4_4_ = fVar129;
                auVar109._0_4_ = fVar129;
                auVar109._8_4_ = fVar129;
                auVar109._12_4_ = fVar129;
                auVar81 = vfmadd213ps_fma(auVar109,local_9a0._0_16_,_DAT_01f7aa10);
                auVar80._0_4_ = fVar103 * local_aa0._0_4_;
                auVar80._4_4_ = fVar126 * local_aa0._4_4_;
                auVar80._8_4_ = fVar127 * local_aa0._8_4_;
                auVar80._12_4_ = fVar128 * local_aa0._12_4_;
                auVar201 = vfmadd231ps_fma(auVar80,auVar223,auVar133);
                local_6e0._0_16_ = auVar201;
                auVar81 = vsubps_avx(auVar81,auVar201);
                _local_880 = auVar81;
                auVar81 = vdpps_avx(auVar81,auVar81,0x7f);
                local_ac0._0_16_ = auVar81;
                if (auVar81._0_4_ < 0.0) {
                  local_980._0_16_ = ZEXT416((uint)fVar131);
                  local_a80._0_16_ = auVar223;
                  auVar101._0_4_ = sqrtf(auVar81._0_4_);
                  auVar101._4_60_ = extraout_var;
                  auVar81 = auVar101._0_16_;
                  auVar223 = local_a80._0_16_;
                  auVar201 = local_980._0_16_;
                }
                else {
                  auVar81 = vsqrtss_avx(auVar81,auVar81);
                  auVar201 = ZEXT416((uint)fVar131);
                }
                auVar223 = vsubps_avx(local_aa0._0_16_,auVar223);
                auVar215._0_4_ = auVar223._0_4_ * 3.0;
                auVar215._4_4_ = auVar223._4_4_ * 3.0;
                auVar215._8_4_ = auVar223._8_4_ * 3.0;
                auVar215._12_4_ = auVar223._12_4_ * 3.0;
                auVar223 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar201,local_960._0_16_)
                ;
                auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_960._0_16_,auVar201);
                fVar103 = auVar201._0_4_ * 6.0;
                fVar126 = auVar223._0_4_ * 6.0;
                fVar127 = auVar7._0_4_ * 6.0;
                fVar128 = local_960._0_4_ * 6.0;
                auVar148._0_4_ = fVar128 * (float)local_a30._0_4_;
                auVar148._4_4_ = fVar128 * (float)local_a30._4_4_;
                auVar148._8_4_ = fVar128 * fStack_a28;
                auVar148._12_4_ = fVar128 * fStack_a24;
                auVar110._4_4_ = fVar127;
                auVar110._0_4_ = fVar127;
                auVar110._8_4_ = fVar127;
                auVar110._12_4_ = fVar127;
                auVar201 = vfmadd132ps_fma(auVar110,auVar148,local_a10);
                auVar149._4_4_ = fVar126;
                auVar149._0_4_ = fVar126;
                auVar149._8_4_ = fVar126;
                auVar149._12_4_ = fVar126;
                auVar201 = vfmadd132ps_fma(auVar149,auVar201,local_a20);
                auVar223 = vdpps_avx(auVar215,auVar215,0x7f);
                auVar111._4_4_ = fVar103;
                auVar111._0_4_ = fVar103;
                auVar111._8_4_ = fVar103;
                auVar111._12_4_ = fVar103;
                auVar78 = vfmadd132ps_fma(auVar111,auVar201,local_a00);
                auVar201 = vblendps_avx(auVar223,_DAT_01f7aa10,0xe);
                auVar7 = vrsqrtss_avx(auVar201,auVar201);
                fVar127 = auVar223._0_4_;
                fVar103 = auVar7._0_4_;
                auVar7 = vdpps_avx(auVar215,auVar78,0x7f);
                fVar103 = fVar103 * 1.5 + fVar127 * -0.5 * fVar103 * fVar103 * fVar103;
                auVar112._0_4_ = auVar78._0_4_ * fVar127;
                auVar112._4_4_ = auVar78._4_4_ * fVar127;
                auVar112._8_4_ = auVar78._8_4_ * fVar127;
                auVar112._12_4_ = auVar78._12_4_ * fVar127;
                fVar126 = auVar7._0_4_;
                auVar199._0_4_ = auVar215._0_4_ * fVar126;
                auVar199._4_4_ = auVar215._4_4_ * fVar126;
                auVar199._8_4_ = auVar215._8_4_ * fVar126;
                auVar199._12_4_ = auVar215._12_4_ * fVar126;
                auVar7 = vsubps_avx(auVar112,auVar199);
                auVar201 = vrcpss_avx(auVar201,auVar201);
                auVar78 = vfnmadd213ss_fma(auVar201,auVar223,ZEXT416(0x40000000));
                fVar126 = auVar201._0_4_ * auVar78._0_4_;
                auVar201 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                      ZEXT416((uint)(fVar129 * (float)local_700._0_4_)));
                auVar227 = ZEXT1664(auVar201);
                uVar52 = CONCAT44(auVar215._4_4_,auVar215._0_4_);
                local_aa0._0_8_ = uVar52 ^ 0x8000000080000000;
                local_aa0._8_4_ = -auVar215._8_4_;
                local_aa0._12_4_ = -auVar215._12_4_;
                auVar150._0_4_ = fVar103 * auVar7._0_4_ * fVar126;
                auVar150._4_4_ = fVar103 * auVar7._4_4_ * fVar126;
                auVar150._8_4_ = fVar103 * auVar7._8_4_ * fVar126;
                auVar150._12_4_ = fVar103 * auVar7._12_4_ * fVar126;
                local_8a0._0_4_ = auVar215._0_4_ * fVar103;
                local_8a0._4_4_ = auVar215._4_4_ * fVar103;
                local_8a0._8_4_ = auVar215._8_4_ * fVar103;
                local_8a0._12_4_ = auVar215._12_4_ * fVar103;
                local_960._0_16_ = auVar215;
                local_980._0_4_ = auVar201._0_4_;
                if (fVar127 < -fVar127) {
                  local_a80._0_4_ = auVar81._0_4_;
                  local_8c0._0_16_ = auVar150;
                  fVar103 = sqrtf(fVar127);
                  auVar81 = ZEXT416((uint)local_a80._0_4_);
                  auVar227 = ZEXT464((uint)local_980._0_4_);
                  auVar150 = local_8c0._0_16_;
                }
                else {
                  auVar201 = vsqrtss_avx(auVar223,auVar223);
                  fVar103 = auVar201._0_4_;
                }
                auVar201 = vdpps_avx(_local_880,local_8a0._0_16_,0x7f);
                auVar77 = vfmadd213ss_fma(ZEXT416((uint)local_940._0_4_),auVar81,auVar227._0_16_);
                auVar223 = vdpps_avx(local_aa0._0_16_,local_8a0._0_16_,0x7f);
                auVar7 = vdpps_avx(_local_880,auVar150,0x7f);
                auVar78 = vdpps_avx(local_9a0._0_16_,local_8a0._0_16_,0x7f);
                auVar81 = vfmadd213ss_fma(ZEXT416((uint)(auVar81._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_940._0_4_ / fVar103)),auVar77)
                ;
                local_a80._0_4_ = auVar81._0_4_;
                auVar82._0_4_ = auVar201._0_4_ * auVar201._0_4_;
                auVar82._4_4_ = auVar201._4_4_ * auVar201._4_4_;
                auVar82._8_4_ = auVar201._8_4_ * auVar201._8_4_;
                auVar82._12_4_ = auVar201._12_4_ * auVar201._12_4_;
                auVar81 = vdpps_avx(_local_880,local_aa0._0_16_,0x7f);
                auVar132 = vsubps_avx(local_ac0._0_16_,auVar82);
                auVar77 = vrsqrtss_avx(auVar132,auVar132);
                fVar126 = auVar132._0_4_;
                fVar103 = auVar77._0_4_;
                fVar103 = fVar103 * 1.5 + fVar126 * -0.5 * fVar103 * fVar103 * fVar103;
                auVar77 = vdpps_avx(_local_880,local_9a0._0_16_,0x7f);
                local_aa0._0_16_ = ZEXT416((uint)(auVar223._0_4_ + auVar7._0_4_));
                local_8a0._0_16_ = vfnmadd231ss_fma(auVar81,auVar201,local_aa0._0_16_);
                auVar81 = vfnmadd231ss_fma(auVar77,auVar201,auVar78);
                if (fVar126 < 0.0) {
                  local_8c0._0_16_ = auVar201;
                  local_860._0_16_ = auVar78;
                  local_720._0_4_ = fVar103;
                  local_740._0_16_ = auVar81;
                  fVar126 = sqrtf(fVar126);
                  auVar227 = ZEXT464((uint)local_980._0_4_);
                  fVar103 = (float)local_720._0_4_;
                  auVar81 = local_740._0_16_;
                  auVar78 = local_860._0_16_;
                  auVar201 = local_8c0._0_16_;
                }
                else {
                  auVar223 = vsqrtss_avx(auVar132,auVar132);
                  fVar126 = auVar223._0_4_;
                }
                auVar239 = ZEXT3264(auVar224);
                auVar223 = vpermilps_avx(local_6e0._0_16_,0xff);
                fVar126 = fVar126 - auVar223._0_4_;
                auVar7 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xff);
                auVar223 = vfmsub213ss_fma(local_8a0._0_16_,ZEXT416((uint)fVar103),auVar7);
                auVar151._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
                auVar151._8_4_ = auVar78._8_4_ ^ 0x80000000;
                auVar151._12_4_ = auVar78._12_4_ ^ 0x80000000;
                auVar178._0_8_ = auVar223._0_8_ ^ 0x8000000080000000;
                auVar178._8_4_ = auVar223._8_4_ ^ 0x80000000;
                auVar178._12_4_ = auVar223._12_4_ ^ 0x80000000;
                auVar81 = ZEXT416((uint)(auVar81._0_4_ * fVar103));
                auVar223 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar223._0_4_)),
                                           local_aa0._0_16_,auVar81);
                auVar81 = vinsertps_avx(auVar178,auVar81,0x1c);
                uVar73 = auVar223._0_4_;
                auVar179._4_4_ = uVar73;
                auVar179._0_4_ = uVar73;
                auVar179._8_4_ = uVar73;
                auVar179._12_4_ = uVar73;
                auVar81 = vdivps_avx(auVar81,auVar179);
                auVar223 = vinsertps_avx(local_aa0._0_16_,auVar151,0x10);
                auVar223 = vdivps_avx(auVar223,auVar179);
                fVar103 = auVar201._0_4_;
                auVar134._0_4_ = fVar103 * auVar81._0_4_ + fVar126 * auVar223._0_4_;
                auVar134._4_4_ = fVar103 * auVar81._4_4_ + fVar126 * auVar223._4_4_;
                auVar134._8_4_ = fVar103 * auVar81._8_4_ + fVar126 * auVar223._8_4_;
                auVar134._12_4_ = fVar103 * auVar81._12_4_ + fVar126 * auVar223._12_4_;
                auVar85 = vsubps_avx(auVar85,auVar134);
                auVar81 = vandps_avx(auVar201,local_a40);
                if (auVar81._0_4_ < (float)local_a80._0_4_) {
                  auVar201 = vfmadd231ss_fma(ZEXT416((uint)(auVar227._0_4_ + (float)local_a80._0_4_)
                                                    ),local_760._0_16_,ZEXT416(0x36000000));
                  auVar81 = vandps_avx(ZEXT416((uint)fVar126),local_a40);
                  if (auVar81._0_4_ < auVar201._0_4_) {
                    fVar103 = auVar85._0_4_ + (float)local_820._0_4_;
                    bVar63 = 0;
                    if ((fVar103 < (ray->org).field_0.m128[3]) ||
                       (fVar126 = ray->tfar, fVar126 < fVar103)) goto LAB_016315e5;
                    auVar85 = vmovshdup_avx(auVar85);
                    bVar63 = 0;
                    fVar127 = auVar85._0_4_;
                    auVar255 = ZEXT3264(local_920);
                    if ((fVar127 < 0.0) ||
                       (auVar262 = ZEXT3264(local_a60), bVar63 = 0, 1.0 < fVar127))
                    goto LAB_016315e5;
                    auVar85 = vrsqrtss_avx(local_ac0._0_16_,local_ac0._0_16_);
                    fVar128 = auVar85._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar64].ptr;
                    if ((pGVar4->mask & ray->mask) == 0) {
                      bVar63 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar63 = 1, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      fVar128 = fVar128 * 1.5 + local_ac0._0_4_ * -0.5 * fVar128 * fVar128 * fVar128
                      ;
                      auVar152._0_4_ = fVar128 * (float)local_880._0_4_;
                      auVar152._4_4_ = fVar128 * (float)local_880._4_4_;
                      auVar152._8_4_ = fVar128 * fStack_878;
                      auVar152._12_4_ = fVar128 * fStack_874;
                      auVar223 = vfmadd213ps_fma(auVar7,auVar152,local_960._0_16_);
                      auVar85 = vshufps_avx(auVar152,auVar152,0xc9);
                      auVar81 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xc9);
                      auVar153._0_4_ = auVar152._0_4_ * auVar81._0_4_;
                      auVar153._4_4_ = auVar152._4_4_ * auVar81._4_4_;
                      auVar153._8_4_ = auVar152._8_4_ * auVar81._8_4_;
                      auVar153._12_4_ = auVar152._12_4_ * auVar81._12_4_;
                      auVar201 = vfmsub231ps_fma(auVar153,local_960._0_16_,auVar85);
                      auVar85 = vshufps_avx(auVar201,auVar201,0xc9);
                      auVar81 = vshufps_avx(auVar223,auVar223,0xc9);
                      auVar201 = vshufps_avx(auVar201,auVar201,0xd2);
                      auVar83._0_4_ = auVar223._0_4_ * auVar201._0_4_;
                      auVar83._4_4_ = auVar223._4_4_ * auVar201._4_4_;
                      auVar83._8_4_ = auVar223._8_4_ * auVar201._8_4_;
                      auVar83._12_4_ = auVar223._12_4_ * auVar201._12_4_;
                      auVar81 = vfmsub231ps_fma(auVar83,auVar85,auVar81);
                      auVar85 = vshufps_avx(auVar81,auVar81,0xe9);
                      local_900 = vmovlps_avx(auVar85);
                      local_8f8 = auVar81._0_4_;
                      local_8f0 = 0;
                      local_8ec = (undefined4)local_8c8;
                      local_8e4 = context->user->instID[0];
                      local_8e0 = context->user->instPrimID[0];
                      ray->tfar = fVar103;
                      local_6c0._0_4_ = 0xffffffff;
                      local_9f0.valid = (int *)local_6c0;
                      local_9f0.geometryUserPtr = pGVar4->userPtr;
                      local_9f0.context = context->user;
                      local_9f0.hit = (RTCHitN *)&local_900;
                      local_9f0.N = 1;
                      local_9f0.ray = (RTCRayN *)ray;
                      local_8f4 = fVar127;
                      local_8e8 = uVar64;
                      if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01631803:
                        p_Var5 = context->args->filter;
                        if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar239 = ZEXT1664(auVar239._0_16_);
                          (*p_Var5)(&local_9f0);
                          if (*local_9f0.valid == 0) goto LAB_01631847;
                        }
                        bVar63 = 1;
                      }
                      else {
                        auVar239 = ZEXT1664(auVar222);
                        (*pGVar4->occlusionFilterN)(&local_9f0);
                        if (*local_9f0.valid != 0) goto LAB_01631803;
LAB_01631847:
                        ray->tfar = fVar126;
                        bVar63 = 0;
                      }
                      auVar262 = ZEXT3264(local_a60);
                      auVar255 = ZEXT3264(local_920);
                    }
                    goto LAB_016315e9;
                  }
                }
                bVar72 = uVar68 < 4;
                uVar68 = uVar68 + 1;
              } while (uVar68 != 5);
              bVar72 = false;
              bVar63 = 5;
LAB_016315e5:
              auVar262 = ZEXT3264(local_a60);
              auVar255 = ZEXT3264(local_920);
LAB_016315e9:
              bVar69 = (bool)(bVar69 | bVar72 & bVar63);
              fVar103 = ray->tfar;
              auVar95._4_4_ = fVar103;
              auVar95._0_4_ = fVar103;
              auVar95._8_4_ = fVar103;
              auVar95._12_4_ = fVar103;
              auVar95._16_4_ = fVar103;
              auVar95._20_4_ = fVar103;
              auVar95._24_4_ = fVar103;
              auVar95._28_4_ = fVar103;
              auVar263 = vcmpps_avx(_local_9c0,auVar95,2);
              auVar90 = vandps_avx(auVar263,local_4e0);
              auVar227 = ZEXT3264(auVar90);
              auVar263 = local_4e0 & auVar263;
              local_4e0 = auVar90;
            } while ((((((((auVar263 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar263 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar263 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar263 >> 0x7f,0) != '\0') ||
                       (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar263 >> 0xbf,0) != '\0') ||
                     (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar263[0x1f] < '\0');
            auVar247 = ZEXT3264(local_5c0);
            auVar90 = local_600;
            auVar263 = local_5a0;
            fVar103 = (float)local_5e0._0_4_;
            fVar126 = (float)local_5e0._4_4_;
            fVar127 = fStack_5d8;
            fVar128 = fStack_5d4;
            fVar131 = fStack_5d0;
            fVar129 = fStack_5cc;
            fVar130 = fStack_5c8;
          }
          auVar125._0_4_ = fVar103 * (float)local_800._0_4_;
          auVar125._4_4_ = fVar126 * (float)local_800._4_4_;
          auVar125._8_4_ = fVar127 * fStack_7f8;
          auVar125._12_4_ = fVar128 * fStack_7f4;
          auVar125._16_4_ = fVar131 * fStack_7f0;
          auVar125._20_4_ = fVar129 * fStack_7ec;
          auVar125._28_36_ = auVar227._28_36_;
          auVar125._24_4_ = fVar130 * fStack_7e8;
          auVar85 = vfmadd213ps_fma(local_7e0,auVar247._0_32_,auVar125._0_32_);
          auVar85 = vfmadd213ps_fma(_local_7c0,auVar263,ZEXT1632(auVar85));
          auVar56._4_4_ = uStack_79c;
          auVar56._0_4_ = local_7a0;
          auVar56._8_4_ = uStack_798;
          auVar56._12_4_ = uStack_794;
          auVar56._16_4_ = uStack_790;
          auVar56._20_4_ = uStack_78c;
          auVar56._24_4_ = uStack_788;
          auVar56._28_4_ = uStack_784;
          auVar263 = vandps_avx(ZEXT1632(auVar85),auVar56);
          auVar141._8_4_ = 0x3e99999a;
          auVar141._0_8_ = 0x3e99999a3e99999a;
          auVar141._12_4_ = 0x3e99999a;
          auVar141._16_4_ = 0x3e99999a;
          auVar141._20_4_ = 0x3e99999a;
          auVar141._24_4_ = 0x3e99999a;
          auVar141._28_4_ = 0x3e99999a;
          auVar263 = vcmpps_avx(auVar263,auVar141,1);
          auVar263 = vorps_avx(auVar263,auVar90);
          auVar142._0_4_ = (float)local_840._0_4_ + local_680._0_4_;
          auVar142._4_4_ = (float)local_840._4_4_ + local_680._4_4_;
          auVar142._8_4_ = fStack_838 + local_680._8_4_;
          auVar142._12_4_ = fStack_834 + local_680._12_4_;
          auVar142._16_4_ = fStack_830 + local_680._16_4_;
          auVar142._20_4_ = fStack_82c + local_680._20_4_;
          auVar142._24_4_ = fStack_828 + local_680._24_4_;
          auVar142._28_4_ = fStack_824 + local_680._28_4_;
          auVar90 = vcmpps_avx(auVar142,auVar95,2);
          local_7e0 = vandps_avx(auVar90,local_6a0);
          auVar227 = ZEXT3264(local_7e0);
          auVar143._8_4_ = 3;
          auVar143._0_8_ = 0x300000003;
          auVar143._12_4_ = 3;
          auVar143._16_4_ = 3;
          auVar143._20_4_ = 3;
          auVar143._24_4_ = 3;
          auVar143._28_4_ = 3;
          auVar168._8_4_ = 2;
          auVar168._0_8_ = 0x200000002;
          auVar168._12_4_ = 2;
          auVar168._16_4_ = 2;
          auVar168._20_4_ = 2;
          auVar168._24_4_ = 2;
          auVar168._28_4_ = 2;
          auVar90 = vblendvps_avx(auVar168,auVar143,auVar263);
          _local_800 = vpcmpgtd_avx2(auVar90,local_580);
          auVar90 = vpandn_avx2(_local_800,local_7e0);
          auVar263 = local_7e0 & ~_local_800;
          local_6c0 = auVar90;
          if ((((((((auVar263 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar263 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar263 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar263 >> 0x7f,0) != '\0') ||
                (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar263 >> 0xbf,0) != '\0') ||
              (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar263[0x1f] < '\0') {
            auVar81 = vminps_avx(local_a00,local_a20);
            auVar85 = vmaxps_avx(local_a00,local_a20);
            auVar201 = vminps_avx(local_a10,_local_a30);
            auVar223 = vminps_avx(auVar81,auVar201);
            auVar81 = vmaxps_avx(local_a10,_local_a30);
            auVar201 = vmaxps_avx(auVar85,auVar81);
            auVar85 = vandps_avx(auVar223,local_a40);
            auVar81 = vandps_avx(auVar201,local_a40);
            auVar85 = vmaxps_avx(auVar85,auVar81);
            auVar81 = vmovshdup_avx(auVar85);
            auVar81 = vmaxss_avx(auVar81,auVar85);
            auVar85 = vshufpd_avx(auVar85,auVar85,1);
            auVar85 = vmaxss_avx(auVar85,auVar81);
            local_940._0_4_ = auVar85._0_4_ * 1.9073486e-06;
            local_760._0_16_ = vshufps_avx(auVar201,auVar201,0xff);
            local_7c0._4_4_ = (float)local_840._4_4_ + local_4a0._4_4_;
            local_7c0._0_4_ = (float)local_840._0_4_ + local_4a0._0_4_;
            fStack_7b8 = fStack_838 + local_4a0._8_4_;
            fStack_7b4 = fStack_834 + local_4a0._12_4_;
            fStack_7b0 = fStack_830 + local_4a0._16_4_;
            fStack_7ac = fStack_82c + local_4a0._20_4_;
            fStack_7a8 = fStack_828 + local_4a0._24_4_;
            fStack_7a4 = fStack_824 + local_4a0._28_4_;
            _local_9c0 = local_4a0;
            do {
              auVar97._8_4_ = 0x7f800000;
              auVar97._0_8_ = 0x7f8000007f800000;
              auVar97._12_4_ = 0x7f800000;
              auVar97._16_4_ = 0x7f800000;
              auVar97._20_4_ = 0x7f800000;
              auVar97._24_4_ = 0x7f800000;
              auVar97._28_4_ = 0x7f800000;
              auVar263 = vblendvps_avx(auVar97,_local_9c0,auVar90);
              auVar138 = vshufps_avx(auVar263,auVar263,0xb1);
              auVar138 = vminps_avx(auVar263,auVar138);
              auVar244 = vshufpd_avx(auVar138,auVar138,5);
              auVar138 = vminps_avx(auVar138,auVar244);
              auVar244 = vpermpd_avx2(auVar138,0x4e);
              auVar138 = vminps_avx(auVar138,auVar244);
              auVar138 = vcmpps_avx(auVar263,auVar138,0);
              auVar244 = auVar90 & auVar138;
              auVar263 = auVar90;
              if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar244 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar244 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar244 >> 0x7f,0) != '\0') ||
                    (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar244 >> 0xbf,0) != '\0') ||
                  (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar244[0x1f] < '\0') {
                auVar263 = vandps_avx(auVar138,auVar90);
              }
              uVar66 = vmovmskps_avx(auVar263);
              iVar19 = 0;
              for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
                iVar19 = iVar19 + 1;
              }
              uVar67 = iVar19 << 2;
              local_6c0 = auVar90;
              *(undefined4 *)(local_6c0 + uVar67) = 0;
              aVar1 = (ray->dir).field_0;
              local_9a0._0_16_ = (undefined1  [16])aVar1;
              auVar85 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
              uVar66 = *(uint *)(local_1c0 + uVar67);
              if (auVar85._0_4_ < 0.0) {
                local_ac0._0_16_ = ZEXT416(*(uint *)(local_480 + uVar67));
                fVar103 = sqrtf(auVar85._0_4_);
                auVar85 = local_ac0._0_16_;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
                fVar103 = auVar85._0_4_;
                auVar85 = ZEXT416(*(uint *)(local_480 + uVar67));
              }
              local_700._0_4_ = fVar103 * 1.9073486e-06;
              auVar85 = vinsertps_avx(auVar85,ZEXT416(uVar66),0x10);
              auVar227 = ZEXT1664(auVar85);
              bVar72 = true;
              uVar68 = 0;
              do {
                auVar223 = auVar227._0_16_;
                local_960._0_16_ = vmovshdup_avx(auVar223);
                fVar131 = 1.0 - local_960._0_4_;
                auVar85 = vshufps_avx(auVar223,auVar223,0x55);
                fVar103 = auVar85._0_4_;
                auVar113._0_4_ = local_a20._0_4_ * fVar103;
                fVar126 = auVar85._4_4_;
                auVar113._4_4_ = local_a20._4_4_ * fVar126;
                fVar127 = auVar85._8_4_;
                auVar113._8_4_ = local_a20._8_4_ * fVar127;
                fVar128 = auVar85._12_4_;
                auVar113._12_4_ = local_a20._12_4_ * fVar128;
                auVar135._4_4_ = fVar131;
                auVar135._0_4_ = fVar131;
                auVar135._8_4_ = fVar131;
                auVar135._12_4_ = fVar131;
                auVar85 = vfmadd231ps_fma(auVar113,auVar135,local_a00);
                auVar154._0_4_ = local_a10._0_4_ * fVar103;
                auVar154._4_4_ = local_a10._4_4_ * fVar126;
                auVar154._8_4_ = local_a10._8_4_ * fVar127;
                auVar154._12_4_ = local_a10._12_4_ * fVar128;
                auVar81 = vfmadd231ps_fma(auVar154,auVar135,local_a20);
                auVar200._0_4_ = fVar103 * auVar81._0_4_;
                auVar200._4_4_ = fVar126 * auVar81._4_4_;
                auVar200._8_4_ = fVar127 * auVar81._8_4_;
                auVar200._12_4_ = fVar128 * auVar81._12_4_;
                auVar201 = vfmadd231ps_fma(auVar200,auVar135,auVar85);
                auVar114._0_4_ = fVar103 * (float)local_a30._0_4_;
                auVar114._4_4_ = fVar126 * (float)local_a30._4_4_;
                auVar114._8_4_ = fVar127 * fStack_a28;
                auVar114._12_4_ = fVar128 * fStack_a24;
                auVar85 = vfmadd231ps_fma(auVar114,auVar135,local_a10);
                auVar180._0_4_ = fVar103 * auVar85._0_4_;
                auVar180._4_4_ = fVar126 * auVar85._4_4_;
                auVar180._8_4_ = fVar127 * auVar85._8_4_;
                auVar180._12_4_ = fVar128 * auVar85._12_4_;
                local_aa0._0_16_ = vfmadd231ps_fma(auVar180,auVar135,auVar81);
                uVar73 = auVar227._0_4_;
                auVar115._4_4_ = uVar73;
                auVar115._0_4_ = uVar73;
                auVar115._8_4_ = uVar73;
                auVar115._12_4_ = uVar73;
                auVar85 = vfmadd213ps_fma(auVar115,local_9a0._0_16_,_DAT_01f7aa10);
                auVar84._0_4_ = fVar103 * local_aa0._0_4_;
                auVar84._4_4_ = fVar126 * local_aa0._4_4_;
                auVar84._8_4_ = fVar127 * local_aa0._8_4_;
                auVar84._12_4_ = fVar128 * local_aa0._12_4_;
                auVar81 = vfmadd231ps_fma(auVar84,auVar201,auVar135);
                local_6e0._0_16_ = auVar81;
                auVar85 = vsubps_avx(auVar85,auVar81);
                _local_880 = auVar85;
                auVar85 = vdpps_avx(auVar85,auVar85,0x7f);
                local_ac0._0_16_ = auVar85;
                if (auVar85._0_4_ < 0.0) {
                  local_980._0_16_ = ZEXT416((uint)fVar131);
                  local_a80._0_16_ = auVar201;
                  auVar102._0_4_ = sqrtf(auVar85._0_4_);
                  auVar102._4_60_ = extraout_var_00;
                  auVar227 = ZEXT1664(auVar223);
                  auVar85 = auVar102._0_16_;
                  auVar201 = local_a80._0_16_;
                  auVar81 = local_980._0_16_;
                }
                else {
                  auVar85 = vsqrtss_avx(auVar85,auVar85);
                  auVar81 = ZEXT416((uint)fVar131);
                }
                auVar201 = vsubps_avx(local_aa0._0_16_,auVar201);
                auVar216._0_4_ = auVar201._0_4_ * 3.0;
                auVar216._4_4_ = auVar201._4_4_ * 3.0;
                auVar216._8_4_ = auVar201._8_4_ * 3.0;
                auVar216._12_4_ = auVar201._12_4_ * 3.0;
                auVar201 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar81,local_960._0_16_);
                auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_960._0_16_,auVar81);
                fVar103 = auVar81._0_4_ * 6.0;
                fVar126 = auVar201._0_4_ * 6.0;
                fVar127 = auVar7._0_4_ * 6.0;
                fVar128 = local_960._0_4_ * 6.0;
                auVar155._0_4_ = fVar128 * (float)local_a30._0_4_;
                auVar155._4_4_ = fVar128 * (float)local_a30._4_4_;
                auVar155._8_4_ = fVar128 * fStack_a28;
                auVar155._12_4_ = fVar128 * fStack_a24;
                auVar116._4_4_ = fVar127;
                auVar116._0_4_ = fVar127;
                auVar116._8_4_ = fVar127;
                auVar116._12_4_ = fVar127;
                auVar81 = vfmadd132ps_fma(auVar116,auVar155,local_a10);
                auVar156._4_4_ = fVar126;
                auVar156._0_4_ = fVar126;
                auVar156._8_4_ = fVar126;
                auVar156._12_4_ = fVar126;
                auVar81 = vfmadd132ps_fma(auVar156,auVar81,local_a20);
                auVar201 = vdpps_avx(auVar216,auVar216,0x7f);
                auVar117._4_4_ = fVar103;
                auVar117._0_4_ = fVar103;
                auVar117._8_4_ = fVar103;
                auVar117._12_4_ = fVar103;
                auVar78 = vfmadd132ps_fma(auVar117,auVar81,local_a00);
                auVar81 = vblendps_avx(auVar201,_DAT_01f7aa10,0xe);
                auVar7 = vrsqrtss_avx(auVar81,auVar81);
                fVar127 = auVar201._0_4_;
                fVar103 = auVar7._0_4_;
                auVar7 = vdpps_avx(auVar216,auVar78,0x7f);
                fVar103 = fVar103 * 1.5 + fVar127 * -0.5 * fVar103 * fVar103 * fVar103;
                auVar118._0_4_ = auVar78._0_4_ * fVar127;
                auVar118._4_4_ = auVar78._4_4_ * fVar127;
                auVar118._8_4_ = auVar78._8_4_ * fVar127;
                auVar118._12_4_ = auVar78._12_4_ * fVar127;
                fVar126 = auVar7._0_4_;
                auVar202._0_4_ = auVar216._0_4_ * fVar126;
                auVar202._4_4_ = auVar216._4_4_ * fVar126;
                auVar202._8_4_ = auVar216._8_4_ * fVar126;
                auVar202._12_4_ = auVar216._12_4_ * fVar126;
                auVar7 = vsubps_avx(auVar118,auVar202);
                auVar81 = vrcpss_avx(auVar81,auVar81);
                auVar78 = vfnmadd213ss_fma(auVar81,auVar201,ZEXT416(0x40000000));
                fVar126 = auVar81._0_4_ * auVar78._0_4_;
                auVar81 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                     ZEXT416((uint)(auVar227._0_4_ * (float)local_700._0_4_)));
                auVar247 = ZEXT1664(auVar81);
                uVar52 = CONCAT44(auVar216._4_4_,auVar216._0_4_);
                local_aa0._0_8_ = uVar52 ^ 0x8000000080000000;
                local_aa0._8_4_ = -auVar216._8_4_;
                local_aa0._12_4_ = -auVar216._12_4_;
                auVar157._0_4_ = fVar103 * auVar7._0_4_ * fVar126;
                auVar157._4_4_ = fVar103 * auVar7._4_4_ * fVar126;
                auVar157._8_4_ = fVar103 * auVar7._8_4_ * fVar126;
                auVar157._12_4_ = fVar103 * auVar7._12_4_ * fVar126;
                local_8a0._0_4_ = auVar216._0_4_ * fVar103;
                local_8a0._4_4_ = auVar216._4_4_ * fVar103;
                local_8a0._8_4_ = auVar216._8_4_ * fVar103;
                local_8a0._12_4_ = auVar216._12_4_ * fVar103;
                local_960._0_16_ = auVar216;
                local_980._0_4_ = auVar81._0_4_;
                if (fVar127 < -fVar127) {
                  local_a80._0_4_ = auVar85._0_4_;
                  local_8c0._0_16_ = auVar157;
                  fVar103 = sqrtf(fVar127);
                  auVar85 = ZEXT416((uint)local_a80._0_4_);
                  auVar247 = ZEXT464((uint)local_980._0_4_);
                  auVar157 = local_8c0._0_16_;
                }
                else {
                  auVar81 = vsqrtss_avx(auVar201,auVar201);
                  fVar103 = auVar81._0_4_;
                }
                auVar81 = vdpps_avx(_local_880,local_8a0._0_16_,0x7f);
                auVar77 = vfmadd213ss_fma(ZEXT416((uint)local_940._0_4_),auVar85,auVar247._0_16_);
                auVar201 = vdpps_avx(local_aa0._0_16_,local_8a0._0_16_,0x7f);
                auVar7 = vdpps_avx(_local_880,auVar157,0x7f);
                auVar78 = vdpps_avx(local_9a0._0_16_,local_8a0._0_16_,0x7f);
                auVar85 = vfmadd213ss_fma(ZEXT416((uint)(auVar85._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_940._0_4_ / fVar103)),auVar77)
                ;
                local_a80._0_4_ = auVar85._0_4_;
                auVar86._0_4_ = auVar81._0_4_ * auVar81._0_4_;
                auVar86._4_4_ = auVar81._4_4_ * auVar81._4_4_;
                auVar86._8_4_ = auVar81._8_4_ * auVar81._8_4_;
                auVar86._12_4_ = auVar81._12_4_ * auVar81._12_4_;
                auVar85 = vdpps_avx(_local_880,local_aa0._0_16_,0x7f);
                auVar132 = vsubps_avx(local_ac0._0_16_,auVar86);
                auVar77 = vrsqrtss_avx(auVar132,auVar132);
                fVar126 = auVar132._0_4_;
                fVar103 = auVar77._0_4_;
                fVar103 = fVar103 * 1.5 + fVar126 * -0.5 * fVar103 * fVar103 * fVar103;
                auVar77 = vdpps_avx(_local_880,local_9a0._0_16_,0x7f);
                local_aa0._0_16_ = ZEXT416((uint)(auVar201._0_4_ + auVar7._0_4_));
                local_8a0._0_16_ = vfnmadd231ss_fma(auVar85,auVar81,local_aa0._0_16_);
                auVar85 = vfnmadd231ss_fma(auVar77,auVar81,auVar78);
                if (fVar126 < 0.0) {
                  local_8c0._0_16_ = auVar81;
                  local_860._0_16_ = auVar78;
                  local_720._0_4_ = fVar103;
                  local_740._0_16_ = auVar85;
                  fVar126 = sqrtf(fVar126);
                  auVar247 = ZEXT464((uint)local_980._0_4_);
                  fVar103 = (float)local_720._0_4_;
                  auVar85 = local_740._0_16_;
                  auVar78 = local_860._0_16_;
                  auVar81 = local_8c0._0_16_;
                }
                else {
                  auVar201 = vsqrtss_avx(auVar132,auVar132);
                  fVar126 = auVar201._0_4_;
                }
                auVar239 = ZEXT3264(auVar224);
                auVar201 = vpermilps_avx(local_6e0._0_16_,0xff);
                fVar126 = fVar126 - auVar201._0_4_;
                auVar7 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xff);
                auVar201 = vfmsub213ss_fma(local_8a0._0_16_,ZEXT416((uint)fVar103),auVar7);
                auVar158._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
                auVar158._8_4_ = auVar78._8_4_ ^ 0x80000000;
                auVar158._12_4_ = auVar78._12_4_ ^ 0x80000000;
                auVar181._0_8_ = auVar201._0_8_ ^ 0x8000000080000000;
                auVar181._8_4_ = auVar201._8_4_ ^ 0x80000000;
                auVar181._12_4_ = auVar201._12_4_ ^ 0x80000000;
                auVar85 = ZEXT416((uint)(auVar85._0_4_ * fVar103));
                auVar201 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar201._0_4_)),
                                           local_aa0._0_16_,auVar85);
                auVar85 = vinsertps_avx(auVar181,auVar85,0x1c);
                uVar73 = auVar201._0_4_;
                auVar182._4_4_ = uVar73;
                auVar182._0_4_ = uVar73;
                auVar182._8_4_ = uVar73;
                auVar182._12_4_ = uVar73;
                auVar85 = vdivps_avx(auVar85,auVar182);
                auVar201 = vinsertps_avx(local_aa0._0_16_,auVar158,0x10);
                auVar201 = vdivps_avx(auVar201,auVar182);
                fVar103 = auVar81._0_4_;
                auVar136._0_4_ = fVar103 * auVar85._0_4_ + fVar126 * auVar201._0_4_;
                auVar136._4_4_ = fVar103 * auVar85._4_4_ + fVar126 * auVar201._4_4_;
                auVar136._8_4_ = fVar103 * auVar85._8_4_ + fVar126 * auVar201._8_4_;
                auVar136._12_4_ = fVar103 * auVar85._12_4_ + fVar126 * auVar201._12_4_;
                auVar201 = vsubps_avx(auVar223,auVar136);
                auVar227 = ZEXT1664(auVar201);
                auVar85 = vandps_avx(auVar81,local_a40);
                if (auVar85._0_4_ < (float)local_a80._0_4_) {
                  auVar81 = vfmadd231ss_fma(ZEXT416((uint)(auVar247._0_4_ + (float)local_a80._0_4_))
                                            ,local_760._0_16_,ZEXT416(0x36000000));
                  auVar85 = vandps_avx(ZEXT416((uint)fVar126),local_a40);
                  if (auVar85._0_4_ < auVar81._0_4_) {
                    fVar103 = auVar201._0_4_ + (float)local_820._0_4_;
                    bVar63 = 0;
                    if (fVar103 < (ray->org).field_0.m128[3]) goto LAB_01631f98;
                    fVar126 = ray->tfar;
                    auVar247 = ZEXT464((uint)fVar126);
                    bVar63 = 0;
                    if (fVar126 < fVar103) goto LAB_01631f98;
                    auVar85 = vmovshdup_avx(auVar201);
                    fVar127 = auVar85._0_4_;
                    auVar255 = ZEXT3264(local_920);
                    bVar63 = 0;
                    if ((fVar127 < 0.0) ||
                       (auVar262 = ZEXT3264(local_a60), bVar63 = 0, 1.0 < fVar127))
                    goto LAB_01631f98;
                    auVar85 = vrsqrtss_avx(local_ac0._0_16_,local_ac0._0_16_);
                    fVar128 = auVar85._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar64].ptr;
                    if ((pGVar4->mask & ray->mask) == 0) {
                      bVar63 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar63 = 1, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      fVar128 = fVar128 * 1.5 + local_ac0._0_4_ * -0.5 * fVar128 * fVar128 * fVar128
                      ;
                      auVar159._0_4_ = fVar128 * (float)local_880._0_4_;
                      auVar159._4_4_ = fVar128 * (float)local_880._4_4_;
                      auVar159._8_4_ = fVar128 * fStack_878;
                      auVar159._12_4_ = fVar128 * fStack_874;
                      auVar7 = vfmadd213ps_fma(auVar7,auVar159,local_960._0_16_);
                      auVar85 = vshufps_avx(auVar159,auVar159,0xc9);
                      auVar81 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xc9);
                      auVar160._0_4_ = auVar159._0_4_ * auVar81._0_4_;
                      auVar160._4_4_ = auVar159._4_4_ * auVar81._4_4_;
                      auVar160._8_4_ = auVar159._8_4_ * auVar81._8_4_;
                      auVar160._12_4_ = auVar159._12_4_ * auVar81._12_4_;
                      auVar223 = vfmsub231ps_fma(auVar160,local_960._0_16_,auVar85);
                      auVar85 = vshufps_avx(auVar223,auVar223,0xc9);
                      auVar81 = vshufps_avx(auVar7,auVar7,0xc9);
                      auVar223 = vshufps_avx(auVar223,auVar223,0xd2);
                      auVar87._0_4_ = auVar7._0_4_ * auVar223._0_4_;
                      auVar87._4_4_ = auVar7._4_4_ * auVar223._4_4_;
                      auVar87._8_4_ = auVar7._8_4_ * auVar223._8_4_;
                      auVar87._12_4_ = auVar7._12_4_ * auVar223._12_4_;
                      auVar81 = vfmsub231ps_fma(auVar87,auVar85,auVar81);
                      auVar85 = vshufps_avx(auVar81,auVar81,0xe9);
                      local_900 = vmovlps_avx(auVar85);
                      local_8f8 = auVar81._0_4_;
                      local_8f0 = 0;
                      local_8ec = (undefined4)local_8c8;
                      local_8e4 = context->user->instID[0];
                      local_8e0 = context->user->instPrimID[0];
                      ray->tfar = fVar103;
                      local_ac4 = -1;
                      local_9f0.valid = &local_ac4;
                      local_9f0.geometryUserPtr = pGVar4->userPtr;
                      local_9f0.context = context->user;
                      local_9f0.hit = (RTCHitN *)&local_900;
                      local_9f0.N = 1;
                      local_9f0.ray = (RTCRayN *)ray;
                      local_8f4 = fVar127;
                      local_8e8 = uVar64;
                      if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016321c3:
                        p_Var5 = context->args->filter;
                        if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar227 = ZEXT1664(auVar227._0_16_);
                          auVar239 = ZEXT1664(auVar239._0_16_);
                          auVar247 = ZEXT1664(auVar247._0_16_);
                          (*p_Var5)(&local_9f0);
                          if (*local_9f0.valid == 0) goto LAB_01632210;
                        }
                        bVar63 = 1;
                      }
                      else {
                        auVar227 = ZEXT1664(auVar201);
                        auVar239 = ZEXT1664(auVar222);
                        auVar247 = ZEXT464((uint)fVar126);
                        (*pGVar4->occlusionFilterN)(&local_9f0);
                        if (*local_9f0.valid != 0) goto LAB_016321c3;
LAB_01632210:
                        ray->tfar = fVar126;
                        bVar63 = 0;
                      }
                      auVar262 = ZEXT3264(local_a60);
                      auVar255 = ZEXT3264(local_920);
                    }
                    goto LAB_01631f9c;
                  }
                }
                bVar72 = uVar68 < 4;
                uVar68 = uVar68 + 1;
              } while (uVar68 != 5);
              bVar72 = false;
              bVar63 = 5;
LAB_01631f98:
              auVar262 = ZEXT3264(local_a60);
              auVar255 = ZEXT3264(local_920);
LAB_01631f9c:
              bVar69 = (bool)(bVar69 | bVar72 & bVar63);
              fVar103 = ray->tfar;
              auVar95._4_4_ = fVar103;
              auVar95._0_4_ = fVar103;
              auVar95._8_4_ = fVar103;
              auVar95._12_4_ = fVar103;
              auVar95._16_4_ = fVar103;
              auVar95._20_4_ = fVar103;
              auVar95._24_4_ = fVar103;
              auVar95._28_4_ = fVar103;
              auVar263 = vcmpps_avx(_local_7c0,auVar95,2);
              auVar90 = vandps_avx(auVar263,local_6c0);
              auVar263 = local_6c0 & auVar263;
              local_6c0 = auVar90;
            } while ((((((((auVar263 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar263 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar263 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar263 >> 0x7f,0) != '\0') ||
                       (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar263 >> 0xbf,0) != '\0') ||
                     (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar263[0x1f] < '\0');
          }
          auVar144._0_4_ = (float)local_840._0_4_ + local_460._0_4_;
          auVar144._4_4_ = (float)local_840._4_4_ + local_460._4_4_;
          auVar144._8_4_ = fStack_838 + local_460._8_4_;
          auVar144._12_4_ = fStack_834 + local_460._12_4_;
          auVar144._16_4_ = fStack_830 + local_460._16_4_;
          auVar144._20_4_ = fStack_82c + local_460._20_4_;
          auVar144._24_4_ = fStack_828 + local_460._24_4_;
          auVar144._28_4_ = fStack_824 + local_460._28_4_;
          auVar263 = vcmpps_avx(auVar144,auVar95,2);
          auVar90 = vandps_avx(local_560,local_540);
          auVar90 = vandps_avx(auVar263,auVar90);
          auVar169._0_4_ = (float)local_840._0_4_ + local_4a0._0_4_;
          auVar169._4_4_ = (float)local_840._4_4_ + local_4a0._4_4_;
          auVar169._8_4_ = fStack_838 + local_4a0._8_4_;
          auVar169._12_4_ = fStack_834 + local_4a0._12_4_;
          auVar169._16_4_ = fStack_830 + local_4a0._16_4_;
          auVar169._20_4_ = fStack_82c + local_4a0._20_4_;
          auVar169._24_4_ = fStack_828 + local_4a0._24_4_;
          auVar169._28_4_ = fStack_824 + local_4a0._28_4_;
          auVar138 = vcmpps_avx(auVar169,auVar95,2);
          auVar263 = vandps_avx(_local_800,local_7e0);
          auVar263 = vandps_avx(auVar138,auVar263);
          auVar263 = vorps_avx(auVar90,auVar263);
          if ((((((((auVar263 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar263 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar263 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar263 >> 0x7f,0) != '\0') ||
                (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar263 >> 0xbf,0) != '\0') ||
              (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar263[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar71 * 0x60) = auVar263;
            auVar90 = vblendvps_avx(local_4a0,local_460,auVar90);
            *(undefined1 (*) [32])(auStack_160 + uVar71 * 0x60) = auVar90;
            uVar74 = vmovlps_avx(local_4b0);
            (&uStack_140)[uVar71 * 0xc] = uVar74;
            aiStack_138[uVar71 * 0x18] = local_b44 + 1;
            iVar70 = iVar70 + 1;
          }
        }
      }
    }
    auVar263 = local_400;
    fVar103 = ray->tfar;
    if (iVar70 == 0) break;
    fVar126 = ray->tfar;
    auVar122._4_4_ = fVar126;
    auVar122._0_4_ = fVar126;
    auVar122._8_4_ = fVar126;
    auVar122._12_4_ = fVar126;
    auVar122._16_4_ = fVar126;
    auVar122._20_4_ = fVar126;
    auVar122._24_4_ = fVar126;
    auVar122._28_4_ = fVar126;
    uVar66 = -iVar70;
    pauVar65 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar70 - 1) * 0x60);
    fVar126 = (float)local_840._0_4_;
    fVar127 = (float)local_840._4_4_;
    fVar128 = fStack_838;
    fVar131 = fStack_834;
    fVar129 = fStack_830;
    fVar130 = fStack_82c;
    fVar192 = fStack_828;
    fVar209 = fStack_824;
    while( true ) {
      auVar90 = pauVar65[1];
      auVar145._0_4_ = fVar126 + auVar90._0_4_;
      auVar145._4_4_ = fVar127 + auVar90._4_4_;
      auVar145._8_4_ = fVar128 + auVar90._8_4_;
      auVar145._12_4_ = fVar131 + auVar90._12_4_;
      auVar145._16_4_ = fVar129 + auVar90._16_4_;
      auVar145._20_4_ = fVar130 + auVar90._20_4_;
      auVar145._24_4_ = fVar192 + auVar90._24_4_;
      auVar145._28_4_ = fVar209 + auVar90._28_4_;
      auVar244 = vcmpps_avx(auVar145,auVar122,2);
      auVar138 = vandps_avx(auVar244,*pauVar65);
      local_460 = auVar138;
      auVar244 = *pauVar65 & auVar244;
      if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar244 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar244 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar244 >> 0x7f,0) != '\0') ||
            (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar244 >> 0xbf,0) != '\0') ||
          (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar244[0x1f] < '\0') break;
      pauVar65 = pauVar65 + -3;
      uVar66 = uVar66 + 1;
      fVar126 = (float)local_840._0_4_;
      fVar127 = (float)local_840._4_4_;
      fVar128 = fStack_838;
      fVar131 = fStack_834;
      fVar129 = fStack_830;
      fVar130 = fStack_82c;
      fVar192 = fStack_828;
      fVar209 = fStack_824;
      if (uVar66 == 0) goto LAB_0163251c;
    }
    auVar98._8_4_ = 0x7f800000;
    auVar98._0_8_ = 0x7f8000007f800000;
    auVar98._12_4_ = 0x7f800000;
    auVar98._16_4_ = 0x7f800000;
    auVar98._20_4_ = 0x7f800000;
    auVar98._24_4_ = 0x7f800000;
    auVar98._28_4_ = 0x7f800000;
    auVar90 = vblendvps_avx(auVar98,auVar90,auVar138);
    auVar244 = vshufps_avx(auVar90,auVar90,0xb1);
    auVar244 = vminps_avx(auVar90,auVar244);
    auVar10 = vshufpd_avx(auVar244,auVar244,5);
    auVar244 = vminps_avx(auVar244,auVar10);
    auVar10 = vpermpd_avx2(auVar244,0x4e);
    auVar244 = vminps_avx(auVar244,auVar10);
    auVar90 = vcmpps_avx(auVar90,auVar244,0);
    auVar244 = auVar138 & auVar90;
    if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar244 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar244 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar244 >> 0x7f,0) != '\0') ||
          (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar244 >> 0xbf,0) != '\0') ||
        (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar244[0x1f] < '\0') {
      auVar138 = vandps_avx(auVar90,auVar138);
    }
    uVar68 = *(ulong *)pauVar65[2];
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar68;
    uVar67 = vmovmskps_avx(auVar138);
    iVar70 = 0;
    for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
      iVar70 = iVar70 + 1;
    }
    *(undefined4 *)(local_460 + (uint)(iVar70 << 2)) = 0;
    uVar67 = ~uVar66;
    if ((((((((local_460 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_460 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_460 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_460 >> 0x7f,0) != '\0') ||
          (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_460 >> 0xbf,0) != '\0') ||
        (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_460[0x1f] < '\0') {
      uVar67 = -uVar66;
    }
    uVar71 = (ulong)uVar67;
    local_b44 = *(int *)(pauVar65[2] + 8);
    *pauVar65 = local_460;
    uVar73 = (undefined4)uVar68;
    auVar123._4_4_ = uVar73;
    auVar123._0_4_ = uVar73;
    auVar123._8_4_ = uVar73;
    auVar123._12_4_ = uVar73;
    auVar123._16_4_ = uVar73;
    auVar123._20_4_ = uVar73;
    auVar123._24_4_ = uVar73;
    auVar123._28_4_ = uVar73;
    auVar85 = vmovshdup_avx(auVar88);
    auVar85 = vsubps_avx(auVar85,auVar88);
    auVar99._0_4_ = auVar85._0_4_;
    auVar99._4_4_ = auVar99._0_4_;
    auVar99._8_4_ = auVar99._0_4_;
    auVar99._12_4_ = auVar99._0_4_;
    auVar99._16_4_ = auVar99._0_4_;
    auVar99._20_4_ = auVar99._0_4_;
    auVar99._24_4_ = auVar99._0_4_;
    auVar99._28_4_ = auVar99._0_4_;
    auVar85 = vfmadd132ps_fma(auVar99,auVar123,_DAT_01faff20);
    local_4a0 = ZEXT1632(auVar85);
    local_4b0._8_8_ = 0;
    local_4b0._0_8_ = *(ulong *)(local_4a0 + (uint)(iVar70 << 2));
  } while( true );
LAB_0163251c:
  if (bVar69 != false) {
    return bVar69;
  }
  auVar89._4_4_ = fVar103;
  auVar89._0_4_ = fVar103;
  auVar89._8_4_ = fVar103;
  auVar89._12_4_ = fVar103;
  auVar9 = vcmpps_avx(local_4c0,auVar89,2);
  uVar64 = vmovmskps_avx(auVar9);
  uVar64 = (uint)local_808 & uVar64;
  if (uVar64 == 0) {
    return false;
  }
  goto LAB_0162ffe4;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }